

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_mgga_inc.c
# Opt level: O1

void work_mgga_vxc_pol(xc_func_type *p,size_t np,double *rho,double *sigma,double *lapl,double *tau,
                      xc_mgga_out_params *out)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  double dVar119;
  undefined1 auVar120 [16];
  double dVar142;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  double dVar143;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  double dVar150;
  double dVar151;
  double dVar152;
  double dVar153;
  double dVar154;
  double dVar155;
  double dVar156;
  double dVar157;
  double dVar158;
  double dVar159;
  double dVar160;
  double dVar161;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  double __x;
  double dVar199;
  double dVar200;
  double dVar201;
  double dVar203;
  double dVar204;
  double dVar205;
  double dVar206;
  double dVar207;
  double dVar208;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  double dVar202;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  double dVar257;
  double dVar261;
  double dVar262;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  double dVar258;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  double dVar259;
  undefined1 auVar267 [16];
  double dVar260;
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  double dVar280;
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  double dVar281;
  double dVar282;
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  double dVar307;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  double dVar308;
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  double dVar309;
  double dVar310;
  double dVar312;
  double dVar313;
  double dVar314;
  double dVar315;
  double dVar316;
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  double dVar311;
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  double dVar334;
  double dVar335;
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  double dVar336;
  double dVar337;
  double dVar338;
  double dVar339;
  double dVar340;
  double dVar341;
  double dVar342;
  double dVar359;
  double dVar360;
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  double dVar361;
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  double dVar362;
  double dVar363;
  double dVar364;
  double dVar365;
  double dVar366;
  double dVar367;
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  double dVar379;
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  double dVar380;
  double dVar381;
  double dVar382;
  double dVar383;
  double dVar384;
  double dVar385;
  double dVar386;
  double dVar387;
  undefined1 auVar388 [16];
  double dVar396;
  undefined1 auVar389 [16];
  double dVar397;
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  double dVar398;
  double dVar399;
  double dVar400;
  double dVar401;
  double dVar402;
  double dVar403;
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  double dVar412;
  double dVar413;
  double dVar414;
  double dVar415;
  double dVar416;
  double dVar417;
  double dVar418;
  undefined1 auVar419 [16];
  double dVar424;
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  double dVar425;
  double dVar426;
  double dVar427;
  double dVar428;
  double dVar429;
  double dVar435;
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  double dVar436;
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  double dVar437;
  double dVar438;
  double dVar439;
  double dVar440;
  double dVar441;
  undefined1 auVar442 [16];
  double dVar445;
  undefined1 auVar443 [16];
  double dVar446;
  undefined1 auVar444 [16];
  double dVar447;
  double dVar448;
  double dVar449;
  double dVar450;
  double dVar451;
  double dVar452;
  undefined1 auVar453 [16];
  double dVar457;
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  double local_c70;
  double local_c18;
  double dStack_c10;
  double local_c08;
  double local_b70;
  double local_b28;
  double dStack_b20;
  double local_ad0;
  double local_ac8;
  double local_a48;
  uint local_9a8;
  uint uStack_9a4;
  double local_8a8;
  double dStack_8a0;
  double local_848;
  double local_838;
  double local_808;
  double local_7f8;
  double local_768;
  double dStack_760;
  double local_6f8;
  double dStack_6f0;
  double local_6e8;
  double dStack_6e0;
  double local_6d8;
  double dStack_6d0;
  double local_6a8;
  double dStack_6a0;
  undefined8 local_688;
  double local_608;
  double dStack_600;
  double local_5e8;
  double dStack_5e0;
  double local_5b8;
  double dStack_5b0;
  undefined1 local_428 [176];
  double local_378;
  double dStack_370;
  double local_268;
  double local_248;
  double local_238;
  uint local_188;
  uint uStack_184;
  double dVar411;
  
  if (np != 0) {
    sVar7 = 0;
    local_ad0 = 0.0;
    local_ac8 = 0.0;
    local_c08 = 0.0;
    local_c70 = 0.0;
    do {
      if (p->nspin == 2) {
        lVar6 = (long)(p->dim).rho * sVar7;
        dVar22 = rho[lVar6] + rho[lVar6 + 1];
      }
      else {
        dVar22 = rho[(long)(p->dim).rho * sVar7];
      }
      dVar74 = p->dens_threshold;
      if (dVar74 <= dVar22) {
        lVar6 = (long)(p->dim).rho * sVar7;
        dVar22 = rho[lVar6];
        if (rho[lVar6] <= dVar74) {
          dVar22 = dVar74;
        }
        dVar23 = p->sigma_threshold * p->sigma_threshold;
        lVar8 = (long)(p->dim).sigma * sVar7;
        local_b70 = sigma[lVar8];
        if (sigma[lVar8] <= dVar23) {
          local_b70 = dVar23;
        }
        uVar2 = p->info->flags;
        if ((uVar2 >> 0x10 & 1) != 0) {
          local_ac8 = tau[(long)(p->dim).tau * sVar7];
          if (tau[(long)(p->dim).tau * sVar7] <= p->tau_threshold) {
            local_ac8 = p->tau_threshold;
          }
          if (((uVar2 >> 0x11 & 1) != 0) && (dVar92 = dVar22 * 8.0 * local_ac8, dVar92 <= local_b70)
             ) {
            local_b70 = dVar92;
          }
        }
        if (p->nspin == 2) {
          local_c70 = rho[lVar6 + 1];
          if (rho[lVar6 + 1] <= dVar74) {
            local_c70 = dVar74;
          }
          local_c08 = sigma[lVar8 + 2];
          if (sigma[lVar8 + 2] <= dVar23) {
            local_c08 = dVar23;
          }
          if ((uVar2 >> 0x10 & 1) != 0) {
            local_ad0 = tau[(long)(p->dim).tau * sVar7 + 1];
            if (tau[(long)(p->dim).tau * sVar7 + 1] <= p->tau_threshold) {
              local_ad0 = p->tau_threshold;
            }
            if (((uVar2 >> 0x11 & 1) != 0) &&
               (dVar23 = local_c70 * 8.0 * local_ad0, dVar23 <= local_c08)) {
              local_c08 = dVar23;
            }
          }
        }
        __x = dVar22 + local_c70;
        dVar144 = 1.0 / __x;
        dVar257 = (dVar22 + dVar22) * dVar144;
        dVar23 = p->zeta_threshold;
        dVar280 = dVar23 + -1.0;
        dVar199 = (local_c70 + local_c70) * dVar144;
        dVar309 = -dVar280;
        dVar24 = dVar22 - local_c70;
        dVar336 = dVar24 * dVar144;
        uVar9 = -(ulong)(dVar199 <= dVar23);
        uVar10 = -(ulong)(dVar257 <= dVar23);
        dVar145 = (double)(uVar10 & (ulong)dVar280 |
                          ~uVar10 & (~uVar9 & (ulong)dVar336 | uVar9 & (ulong)dVar309)) + 1.0;
        dVar25 = cbrt(dVar23);
        dVar26 = cbrt(dVar145);
        uVar11 = -(ulong)(dVar145 <= dVar23);
        dVar27 = cbrt(__x);
        dVar92 = cbrt(9.0);
        dVar28 = cbrt(0.3183098861837907);
        dVar28 = dVar28 * dVar28 * dVar92 * dVar92;
        dVar93 = p->cam_omega * dVar28;
        dVar29 = 1.0 / dVar27;
        dVar30 = cbrt(9.869604401089358);
        dVar31 = 1.0 / (dVar30 * dVar30);
        dVar32 = dVar31 * 1.8171205928321397;
        dVar94 = dVar22 * dVar22;
        dVar33 = cbrt(dVar22);
        dVar95 = 1.0 / (dVar33 * dVar33);
        dVar34 = dVar95 / dVar94;
        dVar146 = local_b70 * dVar34;
        dVar96 = ((1.0 / dVar30) / 9.869604401089358) * 3.3019272488946267;
        dVar200 = (1.0 / dVar33) / (dVar22 * dVar94 * dVar94);
        dVar35 = dVar32 * 0.1504548888888889;
        dVar36 = local_b70 * local_b70 * dVar96 * 0.002689949046226295 * dVar200 +
                 dVar35 * dVar146 + 1.0;
        dVar37 = pow(dVar36,0.1);
        dVar92 = p->zeta_threshold;
        uVar12 = -(ulong)(1.0 - dVar336 <= dVar92);
        uVar13 = -(ulong)(dVar336 + 1.0 <= dVar92);
        dVar38 = (double)(~uVar13 & (uVar12 & (ulong)dVar309 | ~uVar12 & (ulong)dVar336) |
                         uVar13 & (ulong)dVar280) + 1.0;
        dVar39 = cbrt(dVar38);
        uVar14 = -(ulong)(dVar38 <= dVar92);
        dVar38 = (double)(uVar14 & (ulong)dVar25 | ~uVar14 & (ulong)dVar39);
        auVar120._8_8_ = dVar38;
        auVar120._0_8_ = dVar37;
        auVar120 = divpd(_DAT_00f70e00,auVar120);
        dVar37 = auVar120._0_8_;
        dVar142 = auVar120._8_8_;
        dVar97 = dVar29 * 1.4422495703074083 * dVar93;
        dVar98 = (dVar97 * dVar37 * dVar142) / 18.0;
        dVar92 = 1e-10;
        if (1e-10 <= dVar98) {
          dVar92 = dVar98;
        }
        dVar99 = 1.35;
        if (dVar92 <= 1.35) {
          dVar99 = dVar92;
        }
        dVar40 = 1.0 / dVar99;
        dVar41 = erf(dVar40 * 0.5);
        dVar100 = dVar99 * dVar99;
        dVar42 = exp((1.0 / dVar100) * -0.25);
        dVar68 = dVar92;
        if (dVar92 <= 1.35) {
          dVar68 = 1.35;
        }
        dVar337 = dVar68 * dVar68;
        dVar362 = dVar337 * dVar337;
        dVar201 = dVar362 * dVar362;
        auVar263._0_8_ = dVar201 * dVar201;
        auVar263._8_8_ = dVar201;
        auVar120 = divpd(_DAT_00f70e00,auVar263);
        dVar310 = dVar100 * -2.0 * (dVar42 + -1.0) + dVar42 + -1.5;
        dVar201 = dVar99 + dVar99;
        dVar41 = dVar201 * dVar310 + dVar41 * 1.7724538509055159;
        dVar365 = auVar120._8_8_;
        auVar419._8_8_ = dVar365;
        auVar419._0_8_ = dVar365;
        if (dVar92 < 1.35) {
          local_838 = dVar99 * -2.6666666666666665 * dVar41 + 1.0;
        }
        else {
          auVar240._0_8_ = dVar365 / (dVar337 * dVar362);
          auVar162._0_8_ = 1.0 / (dVar337 * dVar362);
          auVar209._8_8_ = dVar362;
          auVar209._0_8_ = dVar337;
          auVar263 = divpd(_DAT_00f70e00,auVar209);
          auVar264 = divpd(auVar263,_DAT_00f7cff0);
          auVar162._8_8_ = dVar365;
          auVar162 = divpd(auVar162,_DAT_00f7d000);
          auVar263 = divpd(auVar419,auVar209);
          auVar209 = divpd(auVar263,_DAT_00f7d010);
          auVar240._8_8_ = auVar120._0_8_;
          auVar263 = divpd(auVar240,_DAT_00f7d020);
          local_838 = ((((((auVar264._0_8_ - auVar264._8_8_) + auVar162._0_8_) - auVar162._8_8_) +
                        auVar209._0_8_) - auVar209._8_8_) + auVar263._0_8_) - auVar263._8_8_;
        }
        dVar43 = (double)(~uVar11 & (ulong)(dVar26 * dVar145) | uVar11 & (ulong)(dVar23 * dVar25));
        dVar44 = pow(dVar36,0.2);
        dVar145 = 0.27;
        if (dVar92 <= 0.27) {
          dVar145 = dVar92;
        }
        dVar101 = dVar145 * dVar145;
        dVar45 = exp((-1.0 / dVar101) * 0.25);
        dVar46 = erf((1.0 / dVar145) * 0.5);
        dVar116 = dVar92;
        if (dVar92 <= 0.27) {
          dVar116 = 0.27;
        }
        dVar380 = dVar116 * dVar116;
        dVar412 = dVar380 * dVar380;
        dVar398 = dVar412 * dVar412;
        dVar258 = dVar398 * dVar398;
        auVar264._8_8_ = dVar258 * dVar258;
        auVar264._0_8_ = dVar258;
        auVar263 = divpd(_DAT_00f70e00,auVar264);
        dVar228 = dVar101 * dVar101 * 64.0;
        dVar147 = dVar101 * 20.0 - dVar228;
        dVar228 = dVar101 * -36.0 + dVar145 * 17.724538509055158 * dVar46 + dVar147 * dVar45 +
                  dVar228 + -3.0;
        dVar338 = auVar263._0_8_;
        dVar359 = auVar263._8_8_;
        auVar405._8_8_ = dVar338;
        auVar405._0_8_ = dVar338;
        if (dVar92 < 0.27) {
          dVar229 = dVar101 * 24.0 * dVar228 + 1.0;
        }
        else {
          auVar213._0_8_ = dVar398 * dVar380;
          auVar213._8_8_ = dVar258 * dVar380;
          auVar266._0_8_ = dVar412 * dVar398;
          auVar210._8_8_ = auVar266._0_8_;
          auVar210._0_8_ = dVar412;
          auVar266._8_8_ = auVar213._0_8_;
          auVar240 = divpd(auVar405,auVar266);
          auVar241 = divpd(auVar240,_DAT_00fdf330);
          auVar283._8_8_ = dVar359 / auVar266._0_8_;
          auVar283._0_8_ = 0x3f55f15f15f15f16;
          auVar284._8_8_ = 0x47b9867eba1668be;
          auVar284._0_8_ = dVar412;
          auVar284 = divpd(auVar283,auVar284);
          auVar270._0_8_ = dVar380 * dVar412;
          auVar318._0_8_ = -dVar338;
          auVar318._8_8_ = dVar338;
          auVar320._8_8_ = dVar398;
          auVar320._0_8_ = auVar270._0_8_;
          auVar240 = divpd(auVar318,auVar320);
          auVar209 = divpd(auVar240,_DAT_00fdf320);
          dVar229 = dVar398 * auVar270._0_8_;
          auVar317._8_8_ = dVar338 / dVar229;
          auVar317._0_8_ = dVar359;
          auVar318 = divpd(auVar317,_DAT_00fdf340);
          auVar323._8_8_ = 0x3ff0000000000000;
          auVar323._0_8_ = dVar359;
          auVar285._8_8_ = auVar213._0_8_;
          auVar285._0_8_ = dVar380;
          auVar319._8_8_ = 0x3ff0000000000000;
          auVar319._0_8_ = dVar359;
          auVar240 = divpd(auVar319,auVar285);
          auVar320 = divpd(auVar240,_DAT_00fdf360);
          auVar265._8_8_ = 0x3ff0000000000000;
          auVar265._0_8_ = dVar359;
          auVar240 = divpd(auVar265,auVar210);
          auVar266 = divpd(auVar240,_DAT_00fdf370);
          auVar270._8_8_ = dVar229;
          auVar211._8_8_ = 0x3ff0000000000000;
          auVar211._0_8_ = dVar359;
          auVar240 = divpd(auVar211,auVar270);
          auVar264 = divpd(auVar240,_DAT_00fdf380);
          auVar288._0_8_ = dVar359 / dVar398;
          auVar288._8_8_ = dVar338;
          auVar240 = divpd(auVar288,_DAT_00fdf390);
          auVar162 = divpd(auVar323,auVar213);
          auVar162 = divpd(auVar162,_DAT_00fdf3a0);
          dVar229 = auVar162._8_8_ +
                    auVar240._8_8_ +
                    auVar264._8_8_ +
                    auVar266._8_8_ +
                    auVar320._8_8_ +
                    (1.0 / dVar398) * 3.804788961038961e-06 +
                    (1.0 / auVar270._0_8_) / -11520.0 +
                    auVar284._8_8_ + (dVar359 / dVar229) / -3.511556992918352e+39 + auVar284._0_8_ +
                    (dVar338 / dVar412) / 927028425523200.0 +
                    auVar162._0_8_ +
                    auVar240._0_8_ +
                    auVar264._0_8_ +
                    auVar266._0_8_ +
                    auVar320._0_8_ +
                    ((((auVar209._8_8_ + auVar209._0_8_) - auVar241._8_8_) + auVar241._0_8_) -
                    auVar318._8_8_) + auVar318._0_8_;
        }
        dVar148 = 1.0 / dVar44;
        dVar230 = dVar30 * dVar30 * 0.14417005510442776;
        dVar149 = dVar146 * 0.04229627833333333 +
                  local_ac8 * -0.14554132 * (dVar95 / dVar22) + dVar230;
        dVar44 = 1.0 / (dVar44 * dVar44);
        dVar150 = dVar32 * dVar44;
        dVar30 = 0.32;
        if (dVar92 <= 0.32) {
          dVar30 = dVar92;
        }
        dVar151 = dVar30 * dVar30;
        dVar47 = 1.0 / dVar151;
        dVar48 = exp(dVar47 * -0.25);
        dVar49 = erf((1.0 / dVar30) * 0.5);
        dVar161 = dVar92;
        if (dVar92 <= 0.32) {
          dVar161 = 0.32;
        }
        dVar381 = dVar161 * dVar161;
        dVar399 = dVar381 * dVar381;
        dVar413 = dVar399 * dVar399;
        dVar102 = dVar413 * dVar413;
        dVar259 = 1.0 / dVar102;
        auVar241._0_8_ = 1.0 / (dVar102 * dVar102);
        dVar311 = dVar30 * dVar151;
        dVar281 = dVar151 * dVar151;
        dVar231 = dVar30 * dVar281;
        dVar103 = dVar281 * dVar281;
        dVar425 = dVar30 * dVar103 * -122880.0 +
                  dVar281 * dVar311 * 3840.0 + dVar231 * -576.0 + dVar30 * -8.0 + dVar311 * 256.0;
        dVar232 = dVar151 * dVar281;
        dVar282 = dVar232 * 5120.0 + dVar281 * -1440.0 + dVar151 * 224.0 + -35.0;
        dVar447 = dVar151 * 60.0 + -2.0;
        dVar104 = dVar311 * 24.0;
        dVar102 = dVar425 * dVar48 + dVar447 * 3.5449077018110318 * dVar49 + dVar104 * dVar282;
        if (dVar92 < 0.32) {
          dVar202 = dVar30 * 1.1428571428571428 * dVar102 + 1.0;
        }
        else {
          dVar202 = dVar381 * dVar399;
          auVar163._8_8_ = dVar259 / dVar381;
          auVar163._0_8_ = dVar259;
          auVar121._8_8_ = dVar259;
          auVar121._0_8_ = dVar259;
          auVar75._8_8_ = dVar202;
          auVar75._0_8_ = dVar399;
          auVar212._8_8_ = dVar259;
          auVar212._0_8_ = dVar259;
          auVar267._8_8_ = dVar381 * dVar413;
          auVar267._0_8_ = dVar413;
          auVar242._8_8_ = dVar259;
          auVar242._0_8_ = dVar259;
          auVar264 = divpd(auVar242,auVar267);
          auVar286._0_8_ = dVar413 * dVar399;
          auVar286._8_8_ = dVar413 * dVar202;
          auVar240 = divpd(auVar121,auVar286);
          auVar162 = divpd(auVar163,_DAT_00fdf3b0);
          auVar209 = divpd(auVar212,auVar75);
          auVar213 = divpd(auVar209,_DAT_00fdf3c0);
          auVar266 = divpd(auVar264,_DAT_00fdf3d0);
          auVar240 = divpd(auVar240,_DAT_00fdf3e0);
          auVar241._8_8_ = auVar241._0_8_ / dVar381;
          auVar264 = divpd(auVar241,_DAT_00fdf3f0);
          auVar122._8_8_ = auVar241._0_8_;
          auVar122._0_8_ = auVar241._0_8_;
          auVar209 = divpd(auVar122,auVar75);
          auVar209 = divpd(auVar209,_DAT_00fdf400);
          dVar202 = ((((((((((((1.0 / auVar286._8_8_) / -115811942400.0 +
                               (1.0 / auVar286._0_8_) / 2530344960.0 +
                               (1.0 / (dVar381 * dVar413)) / -61501440.0 +
                               (1.0 / dVar413) * 5.871587902837903e-07 +
                               (1.0 / dVar202) / -56448.0 + 0.0003826530612244898 / dVar399 +
                              auVar162._0_8_) - auVar162._8_8_) + auVar213._0_8_) - auVar213._8_8_)
                          + auVar266._0_8_) - auVar266._8_8_) + auVar240._0_8_) - auVar240._8_8_) +
                      auVar264._0_8_) - auVar264._8_8_) + auVar209._0_8_) - auVar209._8_8_;
        }
        dVar233 = dVar31 * dVar202 * 1.8171205928321397;
        dVar203 = dVar146 * dVar44;
        dVar234 = dVar233 * 0.026329605555555555 * dVar203 +
                  local_838 * dVar148 + dVar149 * dVar229 * 0.43209876543209874 * dVar150;
        dVar50 = dVar27 * dVar43 * -0.36927938319101117;
        uVar15 = -(ulong)(dVar22 <= dVar74);
        dVar1 = p->dens_threshold;
        dVar52 = p->zeta_threshold;
        dVar309 = (double)(uVar9 & (ulong)dVar280 |
                          ~uVar9 & ((ulong)dVar309 & uVar10 | ~uVar10 & (ulong)(dVar144 * -dVar24)))
                  + 1.0;
        dVar51 = cbrt(dVar309);
        uVar9 = -(ulong)(dVar309 <= dVar52);
        dVar105 = local_c70 * local_c70;
        dVar52 = cbrt(local_c70);
        dVar152 = 1.0 / (dVar52 * dVar52);
        dVar153 = dVar152 / dVar105;
        dVar106 = local_c08 * dVar153;
        dVar204 = (1.0 / dVar52) / (local_c70 * dVar105 * dVar105);
        dVar53 = dVar96 * 0.002689949046226295 * local_c08 * local_c08 * dVar204 +
                 dVar35 * dVar106 + 1.0;
        dVar54 = pow(dVar53,0.1);
        dVar336 = (double)((ulong)dVar280 & uVar12 |
                          ~uVar12 & ((~uVar13 & (ulong)dVar336 | uVar13 & (ulong)dVar280) ^
                                    0x8000000000000000)) + 1.0;
        dVar280 = p->zeta_threshold;
        dVar55 = cbrt(dVar336);
        uVar16 = -(ulong)(dVar336 <= dVar280);
        dVar280 = (double)((ulong)dVar25 & uVar16 | ~uVar16 & (ulong)dVar55);
        auVar164._8_8_ = dVar280;
        auVar164._0_8_ = dVar54;
        auVar240 = divpd(_DAT_00f70e00,auVar164);
        dVar336 = auVar240._0_8_;
        dVar143 = auVar240._8_8_;
        dVar54 = (dVar97 * dVar336 * dVar143) / 18.0;
        dVar97 = 1e-10;
        if (1e-10 <= dVar54) {
          dVar97 = dVar54;
        }
        dVar107 = 1.35;
        if (dVar97 <= 1.35) {
          dVar107 = dVar97;
        }
        dVar56 = 1.0 / dVar107;
        dVar57 = erf(dVar56 * 0.5);
        dVar108 = dVar107 * dVar107;
        dVar58 = exp((1.0 / dVar108) * -0.25);
        dVar334 = dVar97;
        if (dVar97 <= 1.35) {
          dVar334 = 1.35;
        }
        dVar363 = dVar334 * dVar334;
        dVar382 = dVar363 * dVar363;
        dVar205 = dVar382 * dVar382;
        auVar123._0_8_ = dVar205 * dVar205;
        auVar123._8_8_ = dVar205;
        auVar240 = divpd(_DAT_00f70e00,auVar123);
        dVar205 = dVar108 * -2.0 * (dVar58 + -1.0) + dVar58 + -1.5;
        dVar57 = dVar57 * 1.7724538509055159 + (dVar107 + dVar107) * dVar205;
        local_428._8_8_ = auVar240._8_8_;
        local_428._0_8_ = local_428._8_8_;
        if (dVar97 < 1.35) {
          local_a48 = dVar107 * -2.6666666666666665 * dVar57 + 1.0;
        }
        else {
          auVar76._0_8_ = (double)local_428._8_8_ / (dVar363 * dVar382);
          auVar165._0_8_ = 1.0 / (dVar363 * dVar382);
          auVar124._8_8_ = dVar382;
          auVar124._0_8_ = dVar363;
          auVar209 = divpd(_DAT_00f70e00,auVar124);
          auVar213 = divpd(auVar209,_DAT_00f7cff0);
          auVar165._8_8_ = local_428._8_8_;
          auVar162 = divpd(auVar165,_DAT_00f7d000);
          auVar214._8_8_ = local_428._8_8_;
          auVar214._0_8_ = local_428._8_8_;
          auVar209 = divpd(auVar214,auVar124);
          auVar264 = divpd(auVar209,_DAT_00f7d010);
          auVar76._8_8_ = auVar240._0_8_;
          auVar209 = divpd(auVar76,_DAT_00f7d020);
          local_a48 = ((((((auVar213._0_8_ - auVar213._8_8_) + auVar162._0_8_) - auVar162._8_8_) +
                        auVar264._0_8_) - auVar264._8_8_) + auVar209._0_8_) - auVar209._8_8_;
        }
        dVar309 = (double)(~uVar9 & (ulong)(dVar309 * dVar51) | (ulong)(dVar23 * dVar25) & uVar9);
        local_188 = (uint)uVar15;
        uStack_184 = (uint)(uVar15 >> 0x20);
        local_9a8 = SUB84(dVar50 * dVar234,0);
        uStack_9a4 = (uint)((ulong)(dVar50 * dVar234) >> 0x20);
        local_688 = (double)CONCAT44(~uStack_184 & uStack_9a4,~local_188 & local_9a8);
        dVar59 = pow(dVar53,0.2);
        dVar25 = 0.27;
        if (dVar97 <= 0.27) {
          dVar25 = dVar97;
        }
        dVar109 = dVar25 * dVar25;
        dVar60 = exp((-1.0 / dVar109) * 0.25);
        dVar61 = erf((1.0 / dVar25) * 0.5);
        dVar119 = dVar97;
        if (dVar97 <= 0.27) {
          dVar119 = 0.27;
        }
        dVar383 = dVar119 * dVar119;
        dVar414 = dVar383 * dVar383;
        dVar400 = dVar414 * dVar414;
        dVar260 = dVar400 * dVar400;
        auVar125._8_8_ = dVar260 * dVar260;
        auVar125._0_8_ = dVar260;
        auVar209 = divpd(_DAT_00f70e00,auVar125);
        dVar235 = dVar109 * dVar109 * 64.0;
        dVar154 = dVar109 * 20.0 - dVar235;
        dVar235 = dVar109 * -36.0 + dVar25 * 17.724538509055158 * dVar61 + dVar154 * dVar60 +
                  dVar235 + -3.0;
        dVar208 = auVar209._0_8_;
        dVar360 = auVar209._8_8_;
        auVar243._8_8_ = dVar208;
        auVar243._0_8_ = dVar208;
        if (dVar97 < 0.27) {
          dVar236 = dVar109 * 24.0 * dVar235 + 1.0;
        }
        else {
          auVar77._0_8_ = dVar400 * dVar383;
          auVar77._8_8_ = dVar260 * dVar383;
          auVar126._0_8_ = dVar414 * dVar400;
          auVar215._8_8_ = auVar126._0_8_;
          auVar215._0_8_ = dVar414;
          auVar126._8_8_ = auVar77._0_8_;
          auVar162 = divpd(auVar243,auVar126);
          auVar284 = divpd(auVar162,_DAT_00fdf330);
          auVar287._8_8_ = dVar360 / auVar126._0_8_;
          auVar287._0_8_ = 0x3f55f15f15f15f16;
          auVar127._8_8_ = 0x47b9867eba1668be;
          auVar127._0_8_ = dVar414;
          auVar288 = divpd(auVar287,auVar127);
          auVar128._0_8_ = dVar383 * dVar414;
          auVar166._0_8_ = -dVar208;
          auVar166._8_8_ = dVar208;
          auVar268._8_8_ = dVar400;
          auVar268._0_8_ = auVar128._0_8_;
          auVar162 = divpd(auVar166,auVar268);
          auVar264 = divpd(auVar162,_DAT_00fdf320);
          dVar236 = dVar400 * auVar128._0_8_;
          auVar321._8_8_ = dVar208 / dVar236;
          auVar321._0_8_ = dVar360;
          auVar318 = divpd(auVar321,_DAT_00fdf340);
          auVar167._8_8_ = 0x3ff0000000000000;
          auVar167._0_8_ = dVar360;
          auVar289._8_8_ = auVar77._0_8_;
          auVar289._0_8_ = dVar383;
          auVar322._8_8_ = 0x3ff0000000000000;
          auVar322._0_8_ = dVar360;
          auVar162 = divpd(auVar322,auVar289);
          auVar323 = divpd(auVar162,_DAT_00fdf360);
          auVar269._8_8_ = 0x3ff0000000000000;
          auVar269._0_8_ = dVar360;
          auVar162 = divpd(auVar269,auVar215);
          auVar270 = divpd(auVar162,_DAT_00fdf370);
          auVar128._8_8_ = dVar236;
          auVar216._8_8_ = 0x3ff0000000000000;
          auVar216._0_8_ = dVar360;
          auVar162 = divpd(auVar216,auVar128);
          auVar266 = divpd(auVar162,_DAT_00fdf380);
          auVar129._0_8_ = dVar360 / dVar400;
          auVar129._8_8_ = dVar208;
          auVar162 = divpd(auVar129,_DAT_00fdf390);
          auVar213 = divpd(auVar167,auVar77);
          auVar213 = divpd(auVar213,_DAT_00fdf3a0);
          dVar236 = auVar213._8_8_ +
                    auVar162._8_8_ +
                    auVar266._8_8_ +
                    auVar270._8_8_ +
                    auVar323._8_8_ +
                    (1.0 / dVar400) * 3.804788961038961e-06 +
                    (1.0 / auVar128._0_8_) / -11520.0 +
                    auVar288._8_8_ + (dVar360 / dVar236) / -3.511556992918352e+39 + auVar288._0_8_ +
                    (dVar208 / dVar414) / 927028425523200.0 +
                    auVar213._0_8_ +
                    auVar162._0_8_ +
                    auVar266._0_8_ +
                    auVar270._0_8_ +
                    auVar323._0_8_ +
                    ((((auVar264._8_8_ + auVar264._0_8_) - auVar284._8_8_) + auVar284._0_8_) -
                    auVar318._8_8_) + auVar318._0_8_;
        }
        dVar155 = 1.0 / dVar59;
        dVar156 = dVar106 * 0.04229627833333333 +
                  local_ad0 * -0.14554132 * (dVar152 / local_c70) + dVar230;
        dVar59 = 1.0 / (dVar59 * dVar59);
        dVar157 = dVar32 * dVar59;
        dVar230 = 0.32;
        if (dVar97 <= 0.32) {
          dVar230 = dVar97;
        }
        dVar158 = dVar230 * dVar230;
        dVar62 = 1.0 / dVar158;
        dVar63 = exp(dVar62 * -0.25);
        dVar64 = erf((1.0 / dVar230) * 0.5);
        dVar72 = dVar97;
        if (dVar97 <= 0.32) {
          dVar72 = 0.32;
        }
        dVar401 = dVar72 * dVar72;
        dVar415 = dVar401 * dVar401;
        dVar437 = dVar415 * dVar415;
        dVar110 = dVar437 * dVar437;
        auVar244._0_8_ = 1.0 / dVar110;
        dVar206 = 1.0 / (dVar110 * dVar110);
        dVar364 = dVar230 * dVar158;
        dVar339 = dVar158 * dVar158;
        dVar312 = dVar230 * dVar339;
        dVar111 = dVar339 * dVar339;
        dVar384 = dVar230 * dVar111 * -122880.0 +
                  dVar339 * dVar364 * 3840.0 + dVar312 * -576.0 + dVar230 * -8.0 + dVar364 * 256.0;
        dVar313 = dVar158 * dVar339;
        dVar314 = dVar313 * 5120.0 + dVar339 * -1440.0 + dVar158 * 224.0 + -35.0;
        dVar448 = dVar158 * 60.0 + -2.0;
        dVar112 = dVar364 * 24.0;
        dVar110 = dVar384 * dVar63 + dVar448 * 3.5449077018110318 * dVar64 + dVar112 * dVar314;
        if (dVar97 < 0.32) {
          dVar261 = dVar230 * 1.1428571428571428 * dVar110 + 1.0;
        }
        else {
          dVar261 = dVar401 * dVar415;
          auVar244._8_8_ = auVar244._0_8_ / dVar401;
          auVar130._8_8_ = auVar244._0_8_;
          auVar130._0_8_ = auVar244._0_8_;
          auVar78._8_8_ = dVar261;
          auVar78._0_8_ = dVar415;
          auVar271._8_8_ = auVar244._0_8_;
          auVar271._0_8_ = auVar244._0_8_;
          auVar343._8_8_ = dVar401 * dVar437;
          auVar343._0_8_ = dVar437;
          auVar324._8_8_ = auVar244._0_8_;
          auVar324._0_8_ = auVar244._0_8_;
          auVar266 = divpd(auVar324,auVar343);
          auVar368._0_8_ = dVar437 * dVar415;
          auVar368._8_8_ = dVar437 * dVar261;
          auVar162 = divpd(auVar130,auVar368);
          auVar213 = divpd(auVar244,_DAT_00fdf3b0);
          auVar264 = divpd(auVar271,auVar78);
          auVar284 = divpd(auVar264,_DAT_00fdf3c0);
          auVar270 = divpd(auVar266,_DAT_00fdf3d0);
          auVar162 = divpd(auVar162,_DAT_00fdf3e0);
          auVar245._8_8_ = dVar206 / dVar401;
          auVar245._0_8_ = dVar206;
          auVar266 = divpd(auVar245,_DAT_00fdf3f0);
          auVar131._8_8_ = dVar206;
          auVar131._0_8_ = dVar206;
          auVar264 = divpd(auVar131,auVar78);
          auVar264 = divpd(auVar264,_DAT_00fdf400);
          dVar261 = ((((((((((((1.0 / auVar368._8_8_) / -115811942400.0 +
                               (1.0 / auVar368._0_8_) / 2530344960.0 +
                               (1.0 / (dVar401 * dVar437)) / -61501440.0 +
                               (1.0 / dVar437) * 5.871587902837903e-07 +
                               (1.0 / dVar261) / -56448.0 + 0.0003826530612244898 / dVar415 +
                              auVar213._0_8_) - auVar213._8_8_) + auVar284._0_8_) - auVar284._8_8_)
                          + auVar270._0_8_) - auVar270._8_8_) + auVar162._0_8_) - auVar162._8_8_) +
                      auVar266._0_8_) - auVar266._8_8_) + auVar264._0_8_) - auVar264._8_8_;
        }
        dVar237 = dVar31 * dVar261 * 1.8171205928321397;
        dVar207 = dVar106 * dVar59;
        dVar238 = dVar237 * 0.026329605555555555 * dVar207 +
                  local_a48 * dVar155 + dVar156 * dVar236 * 0.43209876543209874 * dVar157;
        dVar65 = dVar27 * dVar309 * -0.36927938319101117;
        local_688 = local_688 + (double)(~-(ulong)(local_c70 <= dVar1) & (ulong)(dVar65 * dVar238));
        pdVar3 = out->zk;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 1) != 0)) {
          lVar6 = (long)(p->dim).zk * sVar7;
          pdVar3[lVar6] = pdVar3[lVar6] + local_688;
        }
        dVar113 = 1.0 / (__x * __x);
        dVar66 = dVar24 * dVar113;
        dVar114 = dVar144 - dVar66;
        bVar4 = dVar23 < dVar199;
        bVar5 = dVar23 < dVar257;
        local_c18 = 0.0;
        dVar257 = 0.0;
        if (bVar5 && bVar4) {
          dVar257 = dVar114;
        }
        dVar159 = 1.0 / (dVar27 * dVar27);
        dVar93 = (dVar29 / __x) * 1.4422495703074083 * dVar93;
        dVar28 = dVar28 * p->cam_omega * 1.4422495703074083;
        dVar160 = dVar159 * dVar43 * 0.9847450218426964 * dVar234 * 0.125;
        dVar337 = dVar337 * dVar68;
        dVar67 = (dVar37 * dVar142 * dVar93) / 54.0;
        dVar115 = (dVar95 / (dVar22 * dVar94)) * local_b70;
        dVar94 = dVar32 * -0.40121303703703703 * dVar115 +
                 local_b70 * local_b70 * dVar96 * -0.014346394913206906 *
                 ((1.0 / dVar33) / (dVar94 * dVar94 * dVar94));
        dVar38 = 1.0 / (dVar38 * dVar38);
        dVar39 = 1.0 / (dVar39 * dVar39);
        dVar33 = (dVar37 / dVar36) * dVar29;
        if (1e-10 <= dVar98) {
          local_c18 = (dVar37 * dVar29 * dVar28 *
                      (double)(~uVar14 &
                              (ulong)(((double)(~uVar13 & ~uVar12 & (ulong)dVar114) * dVar39) / 3.0)
                              ) * dVar38) / -18.0 +
                      ((dVar33 * dVar28 * dVar94 * dVar142) / -180.0 - dVar67);
        }
        dVar262 = 1.0 / dVar337;
        auVar79._0_8_ = dVar68 * dVar362;
        auVar168._8_8_ = dVar362 * dVar337;
        auVar168._0_8_ = dVar68;
        dVar362 = 1.0 / auVar79._0_8_;
        auVar79._8_8_ = dVar337;
        auVar419 = divpd(auVar419,auVar79);
        auVar442._8_8_ = 0x3ff0000000000000;
        auVar442._0_8_ = dVar365;
        auVar162 = divpd(auVar442,auVar168);
        dVar445 = auVar162._8_8_;
        auVar120 = divpd(auVar120,auVar168);
        dVar365 = (1.0 / dVar100) * dVar42;
        dVar68 = 1.0 / (dVar100 * dVar99);
        dVar100 = (dVar42 + -1.0) * dVar99 * -4.0;
        dVar310 = dVar310 + dVar310;
        uVar17 = -(ulong)(1.35 < dVar92);
        dVar424 = auVar419._8_8_;
        dVar435 = auVar120._8_8_;
        dVar438 = auVar162._0_8_;
        dVar337 = auVar419._0_8_;
        dVar426 = auVar120._0_8_;
        if (dVar92 < 1.35) {
          dVar69 = (double)(~uVar17 & (ulong)local_c18);
          local_7f8 = dVar69 * -2.6666666666666665 * dVar41 +
                      dVar99 * -2.6666666666666665 *
                      ((((dVar100 * dVar69 + dVar68 * dVar69 * dVar42 * 0.5) -
                        dVar69 * dVar40 * dVar42) * dVar201 + dVar310 * dVar69) - dVar69 * dVar365);
        }
        else {
          dVar69 = (double)(uVar17 & (ulong)local_c18);
          auVar325._0_8_ = -dVar262 * dVar69;
          auVar325._8_8_ = dVar362 * dVar69;
          auVar419 = divpd(auVar325,_DAT_00f7d030);
          auVar443._0_8_ = dVar438 * dVar69;
          auVar443._8_8_ = dVar445 * dVar69;
          auVar264 = divpd(auVar443,_DAT_00f7d040);
          auVar326._0_8_ = dVar337 * dVar69;
          auVar326._8_8_ = dVar424 * dVar69;
          auVar162 = divpd(auVar326,_DAT_00f7d050);
          auVar80._0_8_ = dVar69 * dVar426;
          auVar80._8_8_ = dVar69 * dVar435;
          auVar120 = divpd(auVar80,_DAT_00f7d060);
          local_7f8 = ((((((auVar419._8_8_ + auVar419._0_8_) - auVar264._8_8_) + auVar264._0_8_) -
                        auVar162._8_8_) + auVar162._0_8_) - auVar120._8_8_) + auVar120._0_8_;
        }
        auVar132._0_8_ = dVar258 * dVar116;
        auVar132._8_8_ = dVar412 * dVar116;
        auVar327._0_8_ = dVar398 * auVar132._8_8_;
        dVar69 = dVar359 / auVar327._0_8_;
        dVar380 = dVar380 * dVar116;
        auVar81._0_8_ = dVar380 * dVar412;
        auVar81._8_8_ = dVar116 * dVar398;
        dVar258 = 1.0 / auVar81._8_8_;
        auVar344._8_8_ = auVar81._0_8_;
        auVar344._0_8_ = dVar380;
        auVar246._0_8_ = dVar398 * dVar380;
        auVar246._8_8_ = dVar398 * auVar81._0_8_;
        dVar398 = dVar359 / auVar246._8_8_;
        auVar369._8_8_ = auVar327._0_8_;
        auVar369._0_8_ = auVar246._0_8_;
        auVar419 = divpd(auVar405,auVar369);
        auVar404._8_8_ = dVar359;
        auVar404._0_8_ = 0x3ff0000000000000;
        auVar327._8_8_ = dVar116;
        auVar217._8_8_ = dVar359;
        auVar217._0_8_ = 0x3ff0000000000000;
        auVar162 = divpd(auVar217,auVar327);
        auVar272._8_8_ = dVar338;
        auVar272._0_8_ = 0x3ff0000000000000;
        auVar264 = divpd(auVar272,auVar246);
        dVar416 = dVar359 / auVar246._0_8_;
        auVar247._8_8_ = dVar380;
        auVar247._0_8_ = auVar246._8_8_;
        auVar420._8_8_ = dVar359;
        auVar420._0_8_ = 0x3ff0000000000000;
        auVar213 = divpd(auVar420,auVar247);
        auVar120 = divpd(auVar263,auVar344);
        dVar380 = 1.0 / auVar81._0_8_;
        dVar449 = (1.0 / auVar132._8_8_) * -0.005357142857142857;
        auVar266 = divpd(auVar405,auVar81);
        dVar446 = auVar266._8_8_;
        auVar405 = divpd(auVar404,auVar132);
        dVar411 = auVar405._8_8_;
        auVar82._8_8_ = auVar81._8_8_;
        auVar82._0_8_ = auVar132._8_8_;
        auVar263 = divpd(auVar263,auVar82);
        dVar228 = dVar228 * dVar145;
        dVar412 = dVar145 * dVar101 * 256.0;
        dVar147 = (1.0 / (dVar145 * dVar101)) * dVar147;
        dVar116 = (1.0 / dVar145) * dVar45 * -10.0;
        uVar18 = -(ulong)(0.27 < dVar92);
        dVar359 = auVar264._8_8_;
        local_5e8 = auVar419._0_8_;
        dStack_5e0 = auVar419._8_8_;
        local_6e8 = auVar162._0_8_;
        dStack_6e0 = auVar162._8_8_;
        local_6f8 = auVar213._0_8_;
        dStack_6f0 = auVar213._8_8_;
        local_6d8 = auVar120._0_8_;
        dStack_6d0 = auVar120._8_8_;
        local_5b8 = auVar263._0_8_;
        dStack_5b0 = auVar263._8_8_;
        dVar439 = auVar266._0_8_;
        dVar402 = auVar405._0_8_;
        dVar338 = auVar264._0_8_;
        if (dVar92 < 0.27) {
          dVar315 = (double)(~uVar18 & (ulong)local_c18);
          local_808 = dVar228 * 48.0 * dVar315 +
                      dVar101 * 24.0 *
                      (dVar116 * dVar315 +
                      dVar315 * 10.0 * 1.7724538509055159 * dVar46 +
                      dVar145 * dVar315 * -72.0 +
                      (dVar145 * dVar315 * 40.0 - dVar412 * dVar315) * dVar45 +
                      dVar45 * dVar315 * dVar147 * 0.5 + dVar412 * dVar315);
        }
        else {
          dVar315 = (double)(uVar18 & (ulong)local_c18);
          auVar430._0_8_ = dVar439 * dVar315;
          auVar430._8_8_ = dVar446 * dVar315;
          auVar266 = divpd(auVar430,_DAT_00fdf440);
          auVar444._0_8_ = local_5e8 * dVar315;
          auVar444._8_8_ = dStack_5e0 * dVar315;
          auVar284 = divpd(auVar444,_DAT_00fdf450);
          auVar133._0_8_ = -dVar69 * dVar315;
          auVar133._8_8_ = dVar398 * dVar315;
          auVar120 = divpd(auVar133,_DAT_00fdf460);
          auVar273._0_8_ = dVar338 * dVar315;
          auVar273._8_8_ = dVar359 * dVar315;
          auVar162 = divpd(auVar273,_DAT_00fdf470);
          auVar345._0_8_ = local_6e8 * dVar315;
          auVar345._8_8_ = dStack_6e0 * dVar315;
          auVar405 = divpd(auVar345,_DAT_00fdf480);
          auVar134._0_8_ = local_6f8 * dVar315;
          auVar134._8_8_ = dStack_6f0 * dVar315;
          auVar263 = divpd(auVar134,_DAT_00fdf490);
          auVar406._0_8_ = dVar402 * dVar315;
          auVar406._8_8_ = dVar411 * dVar315;
          auVar213 = divpd(auVar406,_DAT_00fdf4a0);
          auVar135._0_8_ = local_6d8 * dVar315;
          auVar135._8_8_ = dStack_6d0 * dVar315;
          auVar419 = divpd(auVar135,_DAT_00fdf4b0);
          auVar328._0_8_ = dVar315 * local_5b8;
          auVar328._8_8_ = dVar315 * dStack_5b0;
          auVar264 = divpd(auVar328,_DAT_00fdf4c0);
          local_808 = auVar264._8_8_ +
                      auVar419._8_8_ +
                      auVar213._8_8_ +
                      auVar263._8_8_ +
                      auVar405._8_8_ +
                      auVar162._8_8_ +
                      (((auVar266._0_8_ - auVar266._8_8_) + auVar284._0_8_) - auVar284._8_8_) +
                      (dVar416 * dVar315) / 8.121312287389663e+33 +
                      auVar264._0_8_ +
                      auVar419._0_8_ +
                      auVar213._0_8_ +
                      auVar263._0_8_ +
                      auVar405._0_8_ +
                      auVar162._0_8_ +
                      dVar258 * -3.0438311688311688e-05 * dVar315 +
                      (dVar380 * dVar315) / 1920.0 +
                      dVar449 * dVar315 + auVar120._8_8_ + auVar120._0_8_;
        }
        auVar388._0_8_ = dVar381 * dVar161;
        auVar388._8_8_ = dVar161;
        auVar407._0_8_ = dVar399 * auVar388._0_8_;
        auVar407._8_8_ = dVar399 * dVar161;
        dVar381 = 1.0 / auVar407._0_8_;
        auVar83._0_8_ = auVar388._0_8_ * dVar413;
        auVar83._8_8_ = dVar161 * dVar413;
        dVar440 = 1.0 / auVar83._0_8_;
        auVar453._8_8_ = dVar259;
        auVar453._0_8_ = dVar259;
        auVar169._8_8_ = dVar259;
        auVar169._0_8_ = dVar259;
        auVar263 = divpd(auVar169,auVar83);
        dVar161 = 1.0 / auVar83._8_8_;
        auVar290._0_8_ = dVar413 * auVar407._0_8_;
        auVar290._8_8_ = dVar413 * auVar407._8_8_;
        dVar417 = 1.0 / auVar290._8_8_;
        dVar413 = 1.0 / auVar290._0_8_;
        auVar84._8_8_ = dVar259;
        auVar84._0_8_ = dVar259;
        auVar120 = divpd(auVar84,auVar388);
        auVar346._8_8_ = dVar259;
        auVar346._0_8_ = dVar259;
        auVar264 = divpd(auVar346,auVar407);
        dVar361 = auVar264._8_8_;
        auVar405 = divpd(auVar453,auVar290);
        dVar457 = auVar405._8_8_;
        auVar291._8_8_ = auVar241._0_8_;
        auVar291._0_8_ = auVar241._0_8_;
        auVar248._8_8_ = auVar241._0_8_;
        auVar248._0_8_ = auVar241._0_8_;
        auVar419 = divpd(auVar248,auVar388);
        auVar162 = divpd(auVar291,auVar407);
        dVar366 = (1.0 / auVar407._8_8_) * -0.001530612244897959;
        dVar425 = (1.0 / dVar311) * dVar425;
        dVar385 = dVar282 * dVar151 * 72.0;
        dVar259 = dVar30 * 1.7724538509055159 * 240.0;
        dVar427 = dVar447 * dVar48 * -2.0;
        uVar19 = -(ulong)(0.32 < dVar92);
        dVar399 = auVar419._8_8_;
        dVar315 = auVar162._8_8_;
        local_378 = auVar120._0_8_;
        dStack_370 = auVar120._8_8_;
        local_6a8 = auVar263._0_8_;
        dStack_6a0 = auVar263._8_8_;
        dVar340 = auVar264._0_8_;
        dVar447 = auVar162._0_8_;
        dVar450 = auVar405._0_8_;
        dVar282 = auVar419._0_8_;
        if (dVar92 < 0.32) {
          local_c18 = (double)(~uVar19 & (ulong)local_c18);
          dVar70 = local_c18 * 1.1428571428571428 * dVar102 +
                   dVar30 * 1.1428571428571428 *
                   (dVar47 * local_c18 * dVar427 +
                   dVar259 * local_c18 * dVar49 +
                   (dVar231 * local_c18 * 30720.0 +
                   dVar30 * local_c18 * 448.0 + dVar311 * local_c18 * -5760.0) * dVar104 +
                   dVar385 * local_c18 +
                   (dVar151 * local_c18 * 768.0 +
                   local_c18 * -8.0 +
                   dVar281 * local_c18 * -2880.0 +
                   dVar103 * -1105920.0 * local_c18 + dVar232 * 26880.0 * local_c18) * dVar48 +
                   dVar48 * local_c18 * dVar425 * 0.5);
        }
        else {
          local_c18 = (double)((ulong)local_c18 & uVar19);
          auVar136._0_8_ = local_378 * local_c18;
          auVar136._8_8_ = dStack_370 * local_c18;
          auVar120 = divpd(auVar136,_DAT_00fdf4d0);
          auVar347._0_8_ = dVar340 * local_c18;
          auVar347._8_8_ = dVar361 * local_c18;
          auVar264 = divpd(auVar347,_DAT_00fdf4e0);
          auVar137._0_8_ = local_6a8 * local_c18;
          auVar137._8_8_ = dStack_6a0 * local_c18;
          auVar263 = divpd(auVar137,_DAT_00fdf4f0);
          auVar454._0_8_ = dVar450 * local_c18;
          auVar454._8_8_ = dVar457 * local_c18;
          auVar405 = divpd(auVar454,_DAT_00fdf500);
          auVar249._0_8_ = dVar282 * local_c18;
          auVar249._8_8_ = dVar399 * local_c18;
          auVar162 = divpd(auVar249,_DAT_00fdf510);
          auVar170._0_8_ = local_c18 * dVar447;
          auVar170._8_8_ = local_c18 * dVar315;
          auVar419 = divpd(auVar170,_DAT_00fdf520);
          dVar70 = (((((((((((((local_c18 * dVar413) / 8272281600.0 +
                              (dVar417 * local_c18) / -210862080.0 +
                              (dVar440 * local_c18) / 6150144.0 +
                              dVar161 * -4.6972703222703225e-06 * local_c18 +
                              dVar366 * local_c18 + (dVar381 * local_c18) / 9408.0) - auVar120._8_8_
                             ) + auVar120._0_8_) - auVar264._8_8_) + auVar264._0_8_) -
                         auVar263._8_8_) + auVar263._0_8_) - auVar405._8_8_) + auVar405._0_8_) -
                     auVar162._8_8_) + auVar162._0_8_) - auVar419._8_8_) + auVar419._0_8_;
        }
        local_838 = local_838 * (dVar148 / dVar36);
        dVar36 = dVar44 / dVar36;
        dVar117 = dVar149 * dVar229 * 1.8171205928321397 * -0.1728395061728395;
        local_238 = 0.0;
        local_248 = 0.0;
        if (dVar74 < dVar22) {
          local_248 = (dVar94 * dVar36 * dVar146 * dVar233 * -0.010531842222222223 +
                      dVar70 * 1.8171205928321397 * dVar31 * 0.026329605555555555 * dVar203 +
                      dVar94 * dVar31 * dVar36 * dVar117 +
                      (local_ac8 * 0.24256886666666666 * dVar34 + dVar115 * -0.11279007555555555) *
                      dVar229 * 0.43209876543209874 * dVar150 +
                      local_808 * dVar149 * 0.43209876543209874 * dVar150 +
                      local_7f8 * dVar148 + (dVar94 * local_838) / -5.0 +
                      dVar115 * dVar44 * dVar233 * -0.07021228148148148) * dVar50 +
                      ((double)(~uVar11 & (ulong)(dVar257 * dVar26 * 1.3333333333333333)) * dVar27 *
                       -0.36927938319101117 * dVar234 - dVar160);
        }
        dVar113 = dVar113 * -dVar24;
        if (dVar23 < dVar199) {
          local_238 = (double)(~uVar10 & (ulong)(-dVar144 - dVar113));
        }
        dVar23 = dVar159 * dVar309 * 0.9847450218426964 * dVar238 * 0.125;
        dVar363 = dVar363 * dVar334;
        dVar93 = (dVar93 * dVar336 * dVar143) / 54.0;
        dVar94 = 1.0 / (dVar280 * dVar280);
        dVar199 = 1.0 / (dVar55 * dVar55);
        dVar24 = 0.0;
        if (1e-10 <= dVar54) {
          dVar24 = (dVar29 * dVar336 * dVar28 *
                   (double)(~uVar16 &
                           (ulong)(((double)(~uVar12 & ~uVar13 & (ulong)-dVar114) * dVar199) / 3.0))
                   * dVar94) / -18.0 - dVar93;
        }
        dVar280 = 1.0 / dVar363;
        auVar85._0_8_ = dVar334 * dVar382;
        auVar408._8_8_ = dVar382 * dVar363;
        auVar408._0_8_ = dVar334;
        dVar115 = 1.0 / auVar85._0_8_;
        auVar85._8_8_ = dVar363;
        auVar263 = divpd(local_428._0_16_,auVar85);
        auVar329._8_8_ = 0x3ff0000000000000;
        auVar329._0_8_ = local_428._8_8_;
        auVar120 = divpd(auVar329,auVar408);
        auVar419 = divpd(auVar240,auVar408);
        dVar114 = (1.0 / dVar108) * dVar58;
        dVar257 = 1.0 / (dVar108 * dVar107);
        dVar108 = (dVar58 + -1.0) * dVar107 * -4.0;
        uVar10 = -(ulong)(1.35 < dVar97);
        dVar334 = auVar120._8_8_;
        dVar382 = auVar263._8_8_;
        dVar70 = auVar419._8_8_;
        dVar55 = auVar120._0_8_;
        dVar363 = auVar263._0_8_;
        dVar159 = auVar419._0_8_;
        if (dVar97 < 1.35) {
          dVar118 = (double)(~uVar10 & (ulong)dVar24);
          dVar71 = (dVar108 * dVar118 + dVar257 * dVar118 * dVar58 * 0.5) -
                   dVar118 * dVar56 * dVar58;
          dVar71 = dVar107 * -2.6666666666666665 *
                   ((dVar71 + dVar71) * dVar107 +
                   ((dVar118 + dVar118) * dVar205 - dVar118 * dVar114));
          dVar118 = dVar118 * -2.6666666666666665 * dVar57;
        }
        else {
          dVar71 = (double)(uVar10 & (ulong)dVar24);
          auVar250._0_8_ = -dVar280 * dVar71;
          auVar250._8_8_ = dVar115 * dVar71;
          auVar263 = divpd(auVar250,_DAT_00f7d030);
          auVar348._0_8_ = dVar55 * dVar71;
          auVar348._8_8_ = dVar334 * dVar71;
          auVar240 = divpd(auVar348,_DAT_00f7d040);
          auVar251._0_8_ = dVar363 * dVar71;
          auVar251._8_8_ = dVar382 * dVar71;
          auVar419 = divpd(auVar251,_DAT_00f7d050);
          auVar86._0_8_ = dVar71 * dVar159;
          auVar86._8_8_ = dVar71 * dVar70;
          auVar120 = divpd(auVar86,_DAT_00f7d060);
          dVar71 = auVar120._0_8_;
          dVar118 = (((((auVar263._8_8_ + auVar263._0_8_) - auVar240._8_8_) + auVar240._0_8_) -
                     auVar419._8_8_) + auVar419._0_8_) - auVar120._8_8_;
        }
        auVar171._0_8_ = dVar260 * dVar119;
        auVar171._8_8_ = dVar414 * dVar119;
        auVar431._0_8_ = dVar400 * auVar171._8_8_;
        dVar260 = dVar360 / auVar431._0_8_;
        dVar383 = dVar383 * dVar119;
        auVar87._0_8_ = dVar383 * dVar414;
        auVar87._8_8_ = dVar119 * dVar400;
        dVar414 = 1.0 / auVar87._8_8_;
        auVar349._8_8_ = auVar87._0_8_;
        auVar349._0_8_ = dVar383;
        auVar252._0_8_ = dVar400 * dVar383;
        auVar252._8_8_ = dVar400 * auVar87._0_8_;
        dVar418 = dVar360 / auVar252._8_8_;
        auVar370._8_8_ = auVar431._0_8_;
        auVar370._0_8_ = auVar252._0_8_;
        auVar263 = divpd(auVar243,auVar370);
        auVar292._8_8_ = dVar360;
        auVar292._0_8_ = 0x3ff0000000000000;
        auVar431._8_8_ = dVar119;
        auVar274._8_8_ = dVar360;
        auVar274._0_8_ = 0x3ff0000000000000;
        auVar120 = divpd(auVar274,auVar431);
        dVar400 = auVar120._8_8_;
        auVar432._8_8_ = dVar208;
        auVar432._0_8_ = 0x3ff0000000000000;
        auVar405 = divpd(auVar432,auVar252);
        dVar436 = auVar405._8_8_;
        dVar451 = dVar360 / auVar252._0_8_;
        auVar253._8_8_ = dVar383;
        auVar253._0_8_ = auVar252._8_8_;
        auVar371._8_8_ = dVar360;
        auVar371._0_8_ = 0x3ff0000000000000;
        auVar162 = divpd(auVar371,auVar253);
        auVar264 = divpd(auVar209,auVar349);
        dVar441 = 1.0 / auVar87._0_8_;
        dVar119 = (1.0 / auVar171._8_8_) * -0.005357142857142857;
        auVar240 = divpd(auVar243,auVar87);
        auVar419 = divpd(auVar292,auVar171);
        auVar88._8_8_ = auVar87._8_8_;
        auVar88._0_8_ = auVar171._8_8_;
        auVar209 = divpd(auVar209,auVar88);
        dVar235 = dVar235 * dVar25;
        dVar341 = dVar25 * dVar109 * 256.0;
        dVar154 = (1.0 / (dVar25 * dVar109)) * dVar154;
        dVar208 = (1.0 / dVar25) * dVar60 * -10.0;
        uVar20 = -(ulong)(0.27 < dVar97);
        dVar335 = auVar240._8_8_;
        dVar307 = auVar419._8_8_;
        dVar396 = auVar209._8_8_;
        local_608 = auVar263._0_8_;
        dStack_600 = auVar263._8_8_;
        local_768 = auVar162._0_8_;
        dStack_760 = auVar162._8_8_;
        local_c18 = auVar264._0_8_;
        dStack_c10 = auVar264._8_8_;
        dVar316 = auVar240._0_8_;
        dVar360 = auVar120._0_8_;
        dVar428 = auVar405._0_8_;
        dVar383 = auVar419._0_8_;
        dVar386 = auVar209._0_8_;
        if (dVar97 < 0.27) {
          dVar239 = (double)(~uVar20 & (ulong)dVar24);
          local_268 = dVar235 * 48.0 * dVar239 +
                      (dVar208 * dVar239 +
                      dVar239 * 10.0 * 1.7724538509055159 * dVar61 +
                      dVar25 * dVar239 * -72.0 +
                      (dVar25 * dVar239 * 40.0 - dVar341 * dVar239) * dVar60 +
                      dVar60 * dVar239 * dVar154 * 0.5 + dVar341 * dVar239) * 24.0 * dVar109;
        }
        else {
          dVar239 = (double)(uVar20 & (ulong)dVar24);
          auVar330._0_8_ = dVar316 * dVar239;
          auVar330._8_8_ = dVar335 * dVar239;
          auVar264 = divpd(auVar330,_DAT_00fdf440);
          auVar455._0_8_ = local_608 * dVar239;
          auVar455._8_8_ = dStack_600 * dVar239;
          auVar213 = divpd(auVar455,_DAT_00fdf450);
          auVar218._0_8_ = -dVar260 * dVar239;
          auVar218._8_8_ = dVar418 * dVar239;
          auVar120 = divpd(auVar218,_DAT_00fdf460);
          auVar433._0_8_ = dVar428 * dVar239;
          auVar433._8_8_ = dVar436 * dVar239;
          auVar405 = divpd(auVar433,_DAT_00fdf470);
          auVar275._0_8_ = dVar360 * dVar239;
          auVar275._8_8_ = dVar400 * dVar239;
          auVar209 = divpd(auVar275,_DAT_00fdf480);
          auVar219._0_8_ = local_768 * dVar239;
          auVar219._8_8_ = dStack_760 * dVar239;
          auVar263 = divpd(auVar219,_DAT_00fdf490);
          auVar293._0_8_ = dVar383 * dVar239;
          auVar293._8_8_ = dVar307 * dVar239;
          auVar162 = divpd(auVar293,_DAT_00fdf4a0);
          auVar220._0_8_ = local_c18 * dVar239;
          auVar220._8_8_ = dStack_c10 * dVar239;
          auVar419 = divpd(auVar220,_DAT_00fdf4b0);
          auVar254._0_8_ = dVar239 * dVar386;
          auVar254._8_8_ = dVar239 * dVar396;
          auVar240 = divpd(auVar254,_DAT_00fdf4c0);
          local_268 = auVar240._8_8_ +
                      auVar419._8_8_ +
                      auVar162._8_8_ +
                      auVar263._8_8_ +
                      auVar209._8_8_ +
                      auVar405._8_8_ +
                      (((auVar264._0_8_ - auVar264._8_8_) + auVar213._0_8_) - auVar213._8_8_) +
                      (dVar451 * dVar239) / 8.121312287389663e+33 +
                      auVar240._0_8_ +
                      auVar419._0_8_ +
                      auVar162._0_8_ +
                      auVar263._0_8_ +
                      auVar209._0_8_ +
                      auVar405._0_8_ +
                      dVar414 * -3.0438311688311688e-05 * dVar239 +
                      (dVar441 * dVar239) / 1920.0 +
                      dVar119 * dVar239 + auVar120._8_8_ + auVar120._0_8_;
        }
        auVar276._0_8_ = dVar401 * dVar72;
        auVar276._8_8_ = dVar72;
        auVar350._0_8_ = dVar415 * auVar276._0_8_;
        auVar350._8_8_ = dVar415 * dVar72;
        dVar401 = 1.0 / auVar350._0_8_;
        auVar89._0_8_ = auVar276._0_8_ * dVar437;
        auVar89._8_8_ = dVar72 * dVar437;
        dVar403 = 1.0 / auVar89._0_8_;
        auVar294._8_8_ = auVar244._0_8_;
        auVar294._0_8_ = auVar244._0_8_;
        auVar389._8_8_ = auVar244._0_8_;
        auVar389._0_8_ = auVar244._0_8_;
        auVar162 = divpd(auVar389,auVar89);
        dVar452 = 1.0 / auVar89._8_8_;
        auVar421._0_8_ = dVar437 * auVar350._0_8_;
        auVar421._8_8_ = dVar437 * auVar350._8_8_;
        dVar429 = 1.0 / auVar421._8_8_;
        dVar72 = 1.0 / auVar421._0_8_;
        auVar372._8_8_ = auVar244._0_8_;
        auVar372._0_8_ = auVar244._0_8_;
        auVar209 = divpd(auVar372,auVar276);
        dVar379 = auVar209._8_8_;
        auVar255._8_8_ = auVar244._0_8_;
        auVar255._0_8_ = auVar244._0_8_;
        auVar263 = divpd(auVar255,auVar350);
        dVar437 = auVar263._8_8_;
        auVar419 = divpd(auVar294,auVar421);
        auVar331._8_8_ = dVar206;
        auVar331._0_8_ = dVar206;
        auVar90._8_8_ = dVar206;
        auVar90._0_8_ = dVar206;
        auVar120 = divpd(auVar90,auVar276);
        auVar240 = divpd(auVar331,auVar350);
        dVar415 = (1.0 / auVar350._8_8_) * -0.001530612244897959;
        dVar384 = (1.0 / dVar364) * dVar384;
        dVar342 = dVar314 * dVar158 * 72.0;
        dVar239 = dVar230 * 1.7724538509055159 * 240.0;
        dVar206 = dVar448 * dVar63 * -2.0;
        uVar21 = -(ulong)(0.32 < dVar97);
        dVar397 = auVar162._8_8_;
        dVar308 = auVar419._8_8_;
        local_8a8 = auVar120._0_8_;
        dStack_8a0 = auVar120._8_8_;
        local_b28 = auVar240._0_8_;
        dStack_b20 = auVar240._8_8_;
        dVar367 = auVar209._0_8_;
        dVar314 = auVar263._0_8_;
        dVar387 = auVar162._0_8_;
        dVar448 = auVar419._0_8_;
        if (dVar97 < 0.32) {
          dVar24 = (double)(~uVar21 & (ulong)dVar24);
          dVar24 = dVar24 * 1.1428571428571428 * dVar110 +
                   dVar230 * 1.1428571428571428 *
                   (dVar62 * dVar24 * dVar206 +
                   dVar239 * dVar24 * dVar64 +
                   (dVar312 * dVar24 * 30720.0 +
                   dVar230 * dVar24 * 448.0 + dVar364 * dVar24 * -5760.0) * dVar112 +
                   dVar342 * dVar24 +
                   (dVar339 * dVar24 * -2880.0 +
                   dVar158 * dVar24 * 768.0 +
                   dVar24 * -8.0 + dVar24 * -1105920.0 * dVar111 + dVar24 * 26880.0 * dVar313) *
                   dVar63 + dVar63 * dVar24 * dVar384 * 0.5);
        }
        else {
          dVar24 = (double)((ulong)dVar24 & uVar21);
          auVar373._0_8_ = dVar367 * dVar24;
          auVar373._8_8_ = dVar379 * dVar24;
          auVar162 = divpd(auVar373,_DAT_00fdf4d0);
          auVar256._0_8_ = dVar314 * dVar24;
          auVar256._8_8_ = dVar437 * dVar24;
          auVar209 = divpd(auVar256,_DAT_00fdf4e0);
          auVar172._0_8_ = dVar387 * dVar24;
          auVar172._8_8_ = dVar397 * dVar24;
          auVar263 = divpd(auVar172,_DAT_00fdf4f0);
          auVar173._0_8_ = dVar448 * dVar24;
          auVar173._8_8_ = dVar308 * dVar24;
          auVar419 = divpd(auVar173,_DAT_00fdf500);
          auVar174._0_8_ = local_8a8 * dVar24;
          auVar174._8_8_ = dStack_8a0 * dVar24;
          auVar240 = divpd(auVar174,_DAT_00fdf510);
          auVar138._0_8_ = dVar24 * local_b28;
          auVar138._8_8_ = dVar24 * dStack_b20;
          auVar120 = divpd(auVar138,_DAT_00fdf520);
          dVar24 = (((((((((((((dVar24 * dVar72) / 8272281600.0 +
                              (dVar429 * dVar24) / -210862080.0 +
                              (dVar403 * dVar24) / 6150144.0 +
                              dVar452 * -4.6972703222703225e-06 * dVar24 +
                              dVar415 * dVar24 + (dVar401 * dVar24) / 9408.0) - auVar162._8_8_) +
                            auVar162._0_8_) - auVar209._8_8_) + auVar209._0_8_) - auVar263._8_8_) +
                        auVar263._0_8_) - auVar419._8_8_) + auVar419._0_8_) - auVar240._8_8_) +
                    auVar240._0_8_) - auVar120._8_8_) + auVar120._0_8_;
        }
        dVar73 = 0.0;
        if (dVar1 < local_c70) {
          dVar73 = (dVar24 * 1.8171205928321397 * dVar31 * 0.026329605555555555 * dVar207 +
                   (dVar118 + dVar71) * dVar155 +
                   local_268 * dVar156 * 0.43209876543209874 * dVar157) * dVar65 +
                   ((double)(~uVar9 & (ulong)(local_238 * dVar51 * 1.3333333333333333)) * dVar27 *
                    -0.36927938319101117 * dVar238 - dVar23);
        }
        pdVar3 = out->vrho;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar6 = (long)(p->dim).vrho * sVar7;
          pdVar3[lVar6] = (local_248 + dVar73) * __x + local_688 + pdVar3[lVar6];
        }
        dVar66 = -dVar144 - dVar66;
        dVar71 = 0.0;
        dVar24 = 0.0;
        if (bVar5 && bVar4) {
          dVar24 = dVar66;
        }
        if (1e-10 <= dVar98) {
          dVar71 = (dVar37 * dVar29 * dVar28 *
                   (double)(~uVar14 &
                           (ulong)((dVar39 * (double)(~uVar13 & ~uVar12 & (ulong)dVar66)) / 3.0)) *
                   dVar38) / -18.0 - dVar67;
        }
        if (dVar92 < 1.35) {
          dVar38 = (double)(~uVar17 & (ulong)dVar71);
          dVar37 = dVar99 * -2.6666666666666665 *
                   ((((dVar100 * dVar38 + dVar68 * dVar38 * dVar42 * 0.5) - dVar38 * dVar40 * dVar42
                     ) * dVar201 + dVar310 * dVar38) - dVar38 * dVar365);
          dVar38 = dVar38 * -2.6666666666666665 * dVar41;
        }
        else {
          dVar37 = (double)(uVar17 & (ulong)dVar71);
          auVar295._0_8_ = -dVar262 * dVar37;
          auVar295._8_8_ = dVar362 * dVar37;
          auVar263 = divpd(auVar295,_DAT_00f7d030);
          auVar351._0_8_ = dVar438 * dVar37;
          auVar351._8_8_ = dVar445 * dVar37;
          auVar240 = divpd(auVar351,_DAT_00f7d040);
          auVar296._0_8_ = dVar337 * dVar37;
          auVar296._8_8_ = dVar424 * dVar37;
          auVar419 = divpd(auVar296,_DAT_00f7d050);
          auVar221._0_8_ = dVar37 * dVar426;
          auVar221._8_8_ = dVar37 * dVar435;
          auVar120 = divpd(auVar221,_DAT_00f7d060);
          dVar37 = auVar120._0_8_;
          dVar38 = (((((auVar263._8_8_ + auVar263._0_8_) - auVar240._8_8_) + auVar240._0_8_) -
                    auVar419._8_8_) + auVar419._0_8_) - auVar120._8_8_;
        }
        if (dVar92 < 0.27) {
          dVar67 = (double)(~uVar18 & (ulong)dVar71);
          dVar39 = (dVar67 * dVar116 +
                   dVar67 * 10.0 * 1.7724538509055159 * dVar46 +
                   dVar145 * dVar67 * -72.0 +
                   (dVar145 * dVar67 * 40.0 - dVar412 * dVar67) * dVar45 +
                   dVar45 * dVar67 * dVar147 * 0.5 + dVar412 * dVar67) * 24.0 * dVar101;
          dVar67 = dVar67 * 48.0 * dVar228;
        }
        else {
          dVar67 = (double)(uVar18 & (ulong)dVar71);
          auVar390._0_8_ = dVar439 * dVar67;
          auVar390._8_8_ = dVar446 * dVar67;
          auVar162 = divpd(auVar390,_DAT_00fdf440);
          auVar297._0_8_ = local_5e8 * dVar67;
          auVar297._8_8_ = dStack_5e0 * dVar67;
          auVar263 = divpd(auVar297,_DAT_00fdf450);
          auVar409._0_8_ = -dVar69 * dVar67;
          auVar409._8_8_ = dVar398 * dVar67;
          auVar213 = divpd(auVar409,_DAT_00fdf460);
          auVar352._0_8_ = dVar338 * dVar67;
          auVar352._8_8_ = dVar359 * dVar67;
          auVar419 = divpd(auVar352,_DAT_00fdf470);
          auVar391._0_8_ = local_6e8 * dVar67;
          auVar391._8_8_ = dStack_6e0 * dVar67;
          auVar264 = divpd(auVar391,_DAT_00fdf480);
          auVar353._0_8_ = local_6f8 * dVar67;
          auVar353._8_8_ = dStack_6f0 * dVar67;
          auVar240 = divpd(auVar353,_DAT_00fdf490);
          auVar392._0_8_ = dVar402 * dVar67;
          auVar392._8_8_ = dVar411 * dVar67;
          auVar405 = divpd(auVar392,_DAT_00fdf4a0);
          auVar354._0_8_ = local_6d8 * dVar67;
          auVar354._8_8_ = dStack_6d0 * dVar67;
          auVar209 = divpd(auVar354,_DAT_00fdf4b0);
          auVar222._0_8_ = dVar67 * local_5b8;
          auVar222._8_8_ = dVar67 * dStack_5b0;
          auVar120 = divpd(auVar222,_DAT_00fdf4c0);
          dVar39 = auVar120._0_8_ +
                   auVar209._0_8_ +
                   auVar405._0_8_ +
                   auVar240._0_8_ +
                   auVar264._0_8_ +
                   auVar419._0_8_ +
                   dVar258 * dVar67 * -3.0438311688311688e-05 +
                   (dVar67 * dVar380) / 1920.0 + dVar449 * dVar67 + auVar213._8_8_ + auVar213._0_8_;
          dVar67 = auVar120._8_8_ +
                   auVar209._8_8_ +
                   auVar405._8_8_ +
                   auVar240._8_8_ +
                   auVar264._8_8_ +
                   auVar419._8_8_ +
                   (((auVar162._0_8_ - auVar162._8_8_) + auVar263._0_8_) - auVar263._8_8_) +
                   (dVar416 * dVar67) / 8.121312287389663e+33;
        }
        if (dVar92 < 0.32) {
          dVar71 = (double)(~uVar19 & (ulong)dVar71);
          dVar71 = dVar71 * 1.1428571428571428 * dVar102 +
                   dVar30 * 1.1428571428571428 *
                   (dVar47 * dVar71 * dVar427 +
                   dVar49 * dVar71 * dVar259 +
                   (dVar231 * dVar71 * 30720.0 +
                   dVar30 * dVar71 * 448.0 + dVar311 * dVar71 * -5760.0) * dVar104 +
                   dVar385 * dVar71 +
                   (dVar232 * dVar71 * 26880.0 +
                   dVar281 * dVar71 * -2880.0 +
                   dVar151 * dVar71 * 768.0 + dVar71 * -1105920.0 * dVar103 + dVar71 * -8.0) *
                   dVar48 + dVar48 * dVar71 * dVar425 * 0.5);
        }
        else {
          dVar71 = (double)((ulong)dVar71 & uVar19);
          auVar298._0_8_ = local_378 * dVar71;
          auVar298._8_8_ = dStack_370 * dVar71;
          auVar263 = divpd(auVar298,_DAT_00fdf4d0);
          auVar299._0_8_ = dVar340 * dVar71;
          auVar299._8_8_ = dVar361 * dVar71;
          auVar419 = divpd(auVar299,_DAT_00fdf4e0);
          auVar300._0_8_ = local_6a8 * dVar71;
          auVar300._8_8_ = dStack_6a0 * dVar71;
          auVar240 = divpd(auVar300,_DAT_00fdf4f0);
          auVar301._0_8_ = dVar450 * dVar71;
          auVar301._8_8_ = dVar457 * dVar71;
          auVar209 = divpd(auVar301,_DAT_00fdf500);
          auVar302._0_8_ = dVar282 * dVar71;
          auVar302._8_8_ = dVar399 * dVar71;
          auVar162 = divpd(auVar302,_DAT_00fdf510);
          auVar91._0_8_ = dVar71 * dVar447;
          auVar91._8_8_ = dVar71 * dVar315;
          auVar120 = divpd(auVar91,_DAT_00fdf520);
          dVar71 = (((((((((((((dVar71 * dVar413) / 8272281600.0 +
                              (dVar417 * dVar71) / -210862080.0 +
                              (dVar440 * dVar71) / 6150144.0 +
                              dVar161 * dVar71 * -4.6972703222703225e-06 +
                              dVar366 * dVar71 + (dVar381 * dVar71) / 9408.0) - auVar263._8_8_) +
                            auVar263._0_8_) - auVar419._8_8_) + auVar419._0_8_) - auVar240._8_8_) +
                        auVar240._0_8_) - auVar209._8_8_) + auVar209._0_8_) - auVar162._8_8_) +
                    auVar162._0_8_) - auVar120._8_8_) + auVar120._0_8_;
        }
        dVar73 = 0.0;
        dVar118 = 0.0;
        if (dVar74 < dVar22) {
          dVar118 = (dVar71 * 1.8171205928321397 * dVar31 * 0.026329605555555555 * dVar203 +
                    (dVar38 + dVar37) * dVar148 +
                    (dVar67 + dVar39) * dVar149 * 0.43209876543209874 * dVar150) * dVar50 +
                    ((double)(~uVar11 & (ulong)(dVar26 * 1.3333333333333333 * dVar24)) * dVar27 *
                     -0.36927938319101117 * dVar234 - dVar160);
        }
        dVar24 = 0.0;
        if (bVar5 && bVar4) {
          dVar24 = dVar144 - dVar113;
        }
        dVar37 = dVar29 * (dVar336 / dVar53);
        dVar38 = (dVar152 / (local_c70 * dVar105)) * local_c08;
        dVar26 = dVar32 * -0.40121303703703703 * dVar38 +
                 local_c08 * local_c08 * dVar96 * -0.014346394913206906 *
                 ((1.0 / dVar52) / (dVar105 * dVar105 * dVar105));
        if (1e-10 <= dVar54) {
          auVar175._0_8_ = dVar26 * dVar143 * dVar28 * dVar37;
          auVar175._8_8_ =
               (double)(~uVar16 &
                       (ulong)(((double)(~uVar12 & ~uVar13 & (ulong)-dVar66) * dVar199) / 3.0)) *
               dVar94 * dVar28 * dVar29 * dVar336;
          auVar120 = divpd(auVar175,_DAT_00fdf810);
          dVar73 = (-dVar93 - auVar120._0_8_) - auVar120._8_8_;
        }
        dVar114 = -dVar114;
        if (dVar97 < 1.35) {
          dVar32 = (double)(~uVar10 & (ulong)dVar73);
          dVar29 = (dVar108 * dVar32 + dVar257 * dVar32 * dVar58 * 0.5) - dVar32 * dVar56 * dVar58;
          dVar29 = dVar107 * -2.6666666666666665 *
                   ((dVar29 + dVar29) * dVar107 + dVar114 * dVar32 + (dVar32 + dVar32) * dVar205);
          dVar32 = dVar32 * -2.6666666666666665 * dVar57;
        }
        else {
          dVar29 = (double)(uVar10 & (ulong)dVar73);
          auVar223._0_8_ = -dVar280 * dVar29;
          auVar223._8_8_ = dVar115 * dVar29;
          auVar263 = divpd(auVar223,_DAT_00f7d030);
          auVar303._0_8_ = dVar55 * dVar29;
          auVar303._8_8_ = dVar334 * dVar29;
          auVar240 = divpd(auVar303,_DAT_00f7d040);
          auVar224._0_8_ = dVar363 * dVar29;
          auVar224._8_8_ = dVar382 * dVar29;
          auVar419 = divpd(auVar224,_DAT_00f7d050);
          auVar176._0_8_ = dVar29 * dVar159;
          auVar176._8_8_ = dVar29 * dVar70;
          auVar120 = divpd(auVar176,_DAT_00f7d060);
          dVar29 = auVar120._0_8_;
          dVar32 = (((((auVar263._8_8_ + auVar263._0_8_) - auVar240._8_8_) + auVar240._0_8_) -
                    auVar419._8_8_) + auVar419._0_8_) - auVar120._8_8_;
        }
        if (dVar97 < 0.27) {
          dVar39 = (double)(~uVar20 & (ulong)dVar73);
          dVar39 = dVar235 * 48.0 * dVar39 +
                   (dVar208 * dVar39 +
                   dVar39 * 10.0 * 1.7724538509055159 * dVar61 +
                   dVar25 * dVar39 * -72.0 +
                   (dVar25 * dVar39 * 40.0 - dVar341 * dVar39) * dVar60 +
                   dVar60 * dVar39 * dVar154 * 0.5 + dVar341 * dVar39) * 24.0 * dVar109;
        }
        else {
          dVar39 = (double)(uVar20 & (ulong)dVar73);
          auVar374._0_8_ = dVar316 * dVar39;
          auVar374._8_8_ = dVar335 * dVar39;
          auVar162 = divpd(auVar374,_DAT_00fdf440);
          auVar225._0_8_ = local_608 * dVar39;
          auVar225._8_8_ = dStack_600 * dVar39;
          auVar263 = divpd(auVar225,_DAT_00fdf450);
          auVar410._0_8_ = -dVar260 * dVar39;
          auVar410._8_8_ = dVar418 * dVar39;
          auVar213 = divpd(auVar410,_DAT_00fdf460);
          auVar304._0_8_ = dVar428 * dVar39;
          auVar304._8_8_ = dVar436 * dVar39;
          auVar419 = divpd(auVar304,_DAT_00fdf470);
          auVar375._0_8_ = dVar360 * dVar39;
          auVar375._8_8_ = dVar400 * dVar39;
          auVar264 = divpd(auVar375,_DAT_00fdf480);
          auVar305._0_8_ = local_768 * dVar39;
          auVar305._8_8_ = dStack_760 * dVar39;
          auVar240 = divpd(auVar305,_DAT_00fdf490);
          auVar376._0_8_ = dVar383 * dVar39;
          auVar376._8_8_ = dVar307 * dVar39;
          auVar405 = divpd(auVar376,_DAT_00fdf4a0);
          auVar306._0_8_ = local_c18 * dVar39;
          auVar306._8_8_ = dStack_c10 * dVar39;
          auVar209 = divpd(auVar306,_DAT_00fdf4b0);
          auVar177._0_8_ = dVar39 * dVar386;
          auVar177._8_8_ = dVar39 * dVar396;
          auVar120 = divpd(auVar177,_DAT_00fdf4c0);
          dVar39 = auVar120._8_8_ +
                   auVar209._8_8_ +
                   auVar405._8_8_ +
                   auVar240._8_8_ +
                   auVar264._8_8_ +
                   auVar419._8_8_ +
                   (((auVar162._0_8_ - auVar162._8_8_) + auVar263._0_8_) - auVar263._8_8_) +
                   (dVar451 * dVar39) / 8.121312287389663e+33 +
                   auVar120._0_8_ +
                   auVar209._0_8_ +
                   auVar405._0_8_ +
                   auVar240._0_8_ +
                   auVar264._0_8_ +
                   auVar419._0_8_ +
                   dVar414 * dVar39 * -3.0438311688311688e-05 +
                   (dVar39 * dVar441) / 1920.0 + dVar119 * dVar39 + auVar213._8_8_ + auVar213._0_8_;
        }
        if (dVar97 < 0.32) {
          dVar73 = (double)(~uVar21 & (ulong)dVar73);
          dVar93 = dVar73 * 1.1428571428571428 * dVar110 +
                   dVar230 * 1.1428571428571428 *
                   (dVar62 * dVar73 * dVar206 +
                   dVar64 * dVar73 * dVar239 +
                   (dVar312 * dVar73 * 30720.0 +
                   dVar230 * dVar73 * 448.0 + dVar364 * dVar73 * -5760.0) * dVar112 +
                   dVar342 * dVar73 +
                   (dVar313 * dVar73 * 26880.0 +
                   dVar339 * dVar73 * -2880.0 +
                   dVar158 * dVar73 * 768.0 + dVar73 * -1105920.0 * dVar111 + dVar73 * -8.0) *
                   dVar63 + dVar63 * dVar73 * dVar384 * 0.5);
        }
        else {
          dVar73 = (double)((ulong)dVar73 & uVar21);
          auVar178._0_8_ = dVar367 * dVar73;
          auVar178._8_8_ = dVar379 * dVar73;
          auVar120 = divpd(auVar178,_DAT_00fdf4d0);
          auVar179._0_8_ = dVar314 * dVar73;
          auVar179._8_8_ = dVar437 * dVar73;
          auVar263 = divpd(auVar179,_DAT_00fdf4e0);
          auVar180._0_8_ = dVar387 * dVar73;
          auVar180._8_8_ = dVar397 * dVar73;
          auVar419 = divpd(auVar180,_DAT_00fdf4f0);
          auVar181._0_8_ = dVar448 * dVar73;
          auVar181._8_8_ = dVar308 * dVar73;
          auVar240 = divpd(auVar181,_DAT_00fdf500);
          auVar182._0_8_ = local_8a8 * dVar73;
          auVar182._8_8_ = dStack_8a0 * dVar73;
          auVar209 = divpd(auVar182,_DAT_00fdf510);
          auVar355._0_8_ = dVar73 * local_b28;
          auVar355._8_8_ = dVar73 * dStack_b20;
          auVar162 = divpd(auVar355,_DAT_00fdf520);
          dVar93 = (((((((((((((dVar73 * dVar72) / 8272281600.0 +
                              (dVar429 * dVar73) / -210862080.0 +
                              (dVar403 * dVar73) / 6150144.0 +
                              dVar452 * dVar73 * -4.6972703222703225e-06 +
                              dVar415 * dVar73 + (dVar401 * dVar73) / 9408.0) - auVar120._8_8_) +
                            auVar120._0_8_) - auVar263._8_8_) + auVar263._0_8_) - auVar419._8_8_) +
                        auVar419._0_8_) - auVar240._8_8_) + auVar240._0_8_) - auVar209._8_8_) +
                    auVar209._0_8_) - auVar162._8_8_) + auVar162._0_8_;
        }
        local_a48 = local_a48 * (dVar155 / dVar53);
        dVar53 = dVar59 / dVar53;
        dVar94 = dVar156 * dVar236 * 1.8171205928321397 * -0.1728395061728395;
        dVar144 = 0.0;
        if (dVar1 < local_c70) {
          dVar144 = (dVar26 * dVar53 * dVar106 * dVar237 * -0.010531842222222223 +
                    dVar93 * 1.8171205928321397 * dVar31 * 0.026329605555555555 * dVar207 +
                    dVar26 * dVar31 * dVar53 * dVar94 +
                    (local_ad0 * 0.24256886666666666 * dVar153 + dVar38 * -0.11279007555555555) *
                    dVar236 * 0.43209876543209874 * dVar157 +
                    dVar39 * dVar156 * 0.43209876543209874 * dVar157 +
                    (dVar32 + dVar29) * dVar155 + (dVar26 * local_a48) / -5.0 +
                    dVar38 * dVar59 * dVar237 * -0.07021228148148148) * dVar65 +
                    ((double)(~uVar9 & (ulong)(dVar24 * dVar51 * 1.3333333333333333)) * dVar27 *
                     -0.36927938319101117 * dVar238 - dVar23);
        }
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar6 = (long)(p->dim).vrho * sVar7;
          pdVar3[lVar6 + 1] = (dVar118 + dVar144) * __x + local_688 + pdVar3[lVar6 + 1];
        }
        dVar23 = dVar35 * dVar34 + dVar200 * local_b70 * dVar96 * 0.00537989809245259;
        dVar24 = 0.0;
        if (1e-10 <= dVar98) {
          dVar24 = (dVar33 * dVar28 * dVar142 * dVar23) / -180.0;
        }
        if (dVar92 < 1.35) {
          dVar26 = (double)(~uVar17 & (ulong)dVar24);
          local_848 = dVar41 * dVar26 * -2.6666666666666665 +
                      dVar99 * -2.6666666666666665 *
                      ((dVar201 * ((dVar100 * dVar26 + dVar68 * dVar26 * dVar42 * 0.5) -
                                  dVar40 * dVar26 * dVar42) + dVar310 * dVar26) - dVar365 * dVar26);
        }
        else {
          dVar26 = (double)(uVar17 & (ulong)dVar24);
          auVar139._0_8_ = -dVar262 * dVar26;
          auVar139._8_8_ = dVar362 * dVar26;
          auVar120 = divpd(auVar139,_DAT_00f7d030);
          auVar332._0_8_ = dVar438 * dVar26;
          auVar332._8_8_ = dVar445 * dVar26;
          auVar419 = divpd(auVar332,_DAT_00f7d040);
          auVar356._0_8_ = dVar337 * dVar26;
          auVar356._8_8_ = dVar424 * dVar26;
          auVar240 = divpd(auVar356,_DAT_00f7d050);
          auVar183._0_8_ = dVar426 * dVar26;
          auVar183._8_8_ = dVar435 * dVar26;
          auVar263 = divpd(auVar183,_DAT_00f7d060);
          local_848 = ((((((auVar120._8_8_ + auVar120._0_8_) - auVar419._8_8_) + auVar419._0_8_) -
                        auVar240._8_8_) + auVar240._0_8_) - auVar263._8_8_) + auVar263._0_8_;
        }
        if (dVar92 < 0.27) {
          dVar26 = (double)(~uVar18 & (ulong)dVar24);
          dVar101 = dVar101 * (dVar116 * dVar26 +
                              dVar26 * 10.0 * 1.7724538509055159 * dVar46 +
                              dVar145 * dVar26 * -72.0 +
                              dVar147 * dVar45 * dVar26 * 0.5 +
                              (dVar145 * dVar26 * 40.0 - dVar412 * dVar26) * dVar45 +
                              dVar412 * dVar26) * 24.0;
          dVar228 = dVar26 * 48.0 * dVar228;
        }
        else {
          dVar26 = (double)(uVar18 & (ulong)dVar24);
          auVar377._0_8_ = dVar439 * dVar26;
          auVar377._8_8_ = dVar446 * dVar26;
          auVar405 = divpd(auVar377,_DAT_00fdf440);
          auVar184._0_8_ = local_5e8 * dVar26;
          auVar184._8_8_ = dStack_5e0 * dVar26;
          auVar419 = divpd(auVar184,_DAT_00fdf450);
          auVar185._0_8_ = -dVar69 * dVar26;
          auVar185._8_8_ = dVar398 * dVar26;
          auVar240 = divpd(auVar185,_DAT_00fdf460);
          auVar186._0_8_ = dVar338 * dVar26;
          auVar186._8_8_ = dVar359 * dVar26;
          auVar209 = divpd(auVar186,_DAT_00fdf470);
          auVar140._0_8_ = local_6e8 * dVar26;
          auVar140._8_8_ = dStack_6e0 * dVar26;
          auVar120 = divpd(auVar140,_DAT_00fdf480);
          auVar187._0_8_ = local_6f8 * dVar26;
          auVar187._8_8_ = dStack_6f0 * dVar26;
          auVar162 = divpd(auVar187,_DAT_00fdf490);
          auVar393._0_8_ = dVar402 * dVar26;
          auVar393._8_8_ = dVar411 * dVar26;
          auVar213 = divpd(auVar393,_DAT_00fdf4a0);
          auVar141._0_8_ = local_6d8 * dVar26;
          auVar141._8_8_ = dStack_6d0 * dVar26;
          auVar263 = divpd(auVar141,_DAT_00fdf4b0);
          auVar188._0_8_ = local_5b8 * dVar26;
          auVar188._8_8_ = dStack_5b0 * dVar26;
          auVar264 = divpd(auVar188,_DAT_00fdf4c0);
          dVar101 = auVar264._0_8_ +
                    auVar263._0_8_ +
                    auVar213._0_8_ +
                    auVar162._0_8_ +
                    auVar120._0_8_ +
                    auVar209._0_8_ +
                    dVar258 * dVar26 * -3.0438311688311688e-05 +
                    (dVar380 * dVar26) / 1920.0 + dVar449 * dVar26 + auVar240._8_8_ + auVar240._0_8_
          ;
          dVar228 = auVar264._8_8_ +
                    auVar263._8_8_ +
                    auVar213._8_8_ +
                    auVar162._8_8_ +
                    auVar120._8_8_ +
                    auVar209._8_8_ +
                    (((auVar405._0_8_ - auVar405._8_8_) + auVar419._0_8_) - auVar419._8_8_) +
                    (dVar416 * dVar26) / 8.121312287389663e+33;
        }
        if (dVar92 < 0.32) {
          dVar24 = (double)(~uVar19 & (ulong)dVar24);
          dVar92 = dVar24 * 1.1428571428571428 * dVar102 +
                   dVar30 * 1.1428571428571428 *
                   (dVar427 * dVar47 * dVar24 +
                   dVar259 * dVar49 * dVar24 +
                   dVar104 * (dVar231 * dVar24 * 30720.0 +
                             dVar30 * dVar24 * 448.0 + dVar311 * dVar24 * -5760.0) +
                   dVar385 * dVar24 +
                   dVar425 * dVar48 * dVar24 * 0.5 +
                   (dVar232 * dVar24 * 26880.0 +
                   dVar281 * dVar24 * -2880.0 +
                   dVar151 * dVar24 * 768.0 + dVar24 * -1105920.0 * dVar103 + dVar24 * -8.0) *
                   dVar48);
        }
        else {
          dVar24 = (double)(uVar19 & (ulong)dVar24);
          auVar189._0_8_ = local_378 * dVar24;
          auVar189._8_8_ = dStack_370 * dVar24;
          auVar120 = divpd(auVar189,_DAT_00fdf4d0);
          auVar190._0_8_ = dVar340 * dVar24;
          auVar190._8_8_ = dVar361 * dVar24;
          auVar263 = divpd(auVar190,_DAT_00fdf4e0);
          auVar357._0_8_ = local_6a8 * dVar24;
          auVar357._8_8_ = dStack_6a0 * dVar24;
          auVar209 = divpd(auVar357,_DAT_00fdf4f0);
          auVar191._0_8_ = dVar450 * dVar24;
          auVar191._8_8_ = dVar457 * dVar24;
          auVar419 = divpd(auVar191,_DAT_00fdf500);
          auVar394._0_8_ = dVar282 * dVar24;
          auVar394._8_8_ = dVar399 * dVar24;
          auVar162 = divpd(auVar394,_DAT_00fdf510);
          auVar192._0_8_ = dVar447 * dVar24;
          auVar192._8_8_ = dVar315 * dVar24;
          auVar240 = divpd(auVar192,_DAT_00fdf520);
          dVar92 = (((((((((((((dVar413 * dVar24) / 8272281600.0 +
                              (dVar417 * dVar24) / -210862080.0 +
                              (dVar440 * dVar24) / 6150144.0 +
                              dVar161 * dVar24 * -4.6972703222703225e-06 +
                              dVar366 * dVar24 + (dVar381 * dVar24) / 9408.0) - auVar120._8_8_) +
                            auVar120._0_8_) - auVar263._8_8_) + auVar263._0_8_) - auVar209._8_8_) +
                        auVar209._0_8_) - auVar419._8_8_) + auVar419._0_8_) - auVar162._8_8_) +
                    auVar162._0_8_) - auVar240._8_8_) + auVar240._0_8_;
        }
        dVar24 = 0.0;
        if (dVar74 < dVar22) {
          dVar24 = dVar50 * (dVar233 * -0.010531842222222223 * dVar146 * dVar36 * dVar23 +
                            dVar92 * 1.8171205928321397 * dVar31 * 0.026329605555555555 * dVar203 +
                            dVar117 * dVar31 * dVar36 * dVar23 +
                            dVar34 * dVar229 * 0.018276169650205763 * dVar150 +
                            dVar149 * (dVar228 + dVar101) * 0.43209876543209874 * dVar150 +
                            local_848 * dVar148 + (local_838 * dVar23) / -5.0 +
                            dVar31 * dVar34 * dVar44 *
                            dVar202 * 1.8171205928321397 * 0.026329605555555555);
        }
        pdVar3 = out->vsigma;
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar6 = (long)(p->dim).vsigma * sVar7;
          pdVar3[lVar6] = dVar24 * __x + pdVar3[lVar6];
          lVar6 = (long)(p->dim).vsigma * sVar7;
          pdVar3[lVar6 + 1] = pdVar3[lVar6 + 1] + 0.0;
        }
        dVar23 = dVar35 * dVar153 + dVar96 * 0.00537989809245259 * local_c08 * dVar204;
        dVar74 = 0.0;
        if (1e-10 <= dVar54) {
          dVar74 = (dVar37 * dVar28 * dVar143 * dVar23) / -180.0;
        }
        if (dVar97 < 1.35) {
          dVar92 = (double)(~uVar10 & (ulong)dVar74);
          dVar24 = (dVar108 * dVar92 + dVar257 * dVar92 * dVar58 * 0.5) - dVar56 * dVar92 * dVar58;
          dVar24 = dVar107 * -2.6666666666666665 *
                   ((dVar24 + dVar24) * dVar107 + dVar114 * dVar92 + dVar205 * (dVar92 + dVar92));
          dVar57 = dVar92 * -2.6666666666666665 * dVar57;
        }
        else {
          dVar92 = (double)(uVar10 & (ulong)dVar74);
          auVar226._0_8_ = -dVar280 * dVar92;
          auVar226._8_8_ = dVar115 * dVar92;
          auVar263 = divpd(auVar226,_DAT_00f7d030);
          auVar422._0_8_ = dVar55 * dVar92;
          auVar422._8_8_ = dVar334 * dVar92;
          auVar240 = divpd(auVar422,_DAT_00f7d040);
          auVar333._0_8_ = dVar363 * dVar92;
          auVar333._8_8_ = dVar382 * dVar92;
          auVar419 = divpd(auVar333,_DAT_00f7d050);
          auVar193._0_8_ = dVar159 * dVar92;
          auVar193._8_8_ = dVar70 * dVar92;
          auVar120 = divpd(auVar193,_DAT_00f7d060);
          dVar24 = auVar120._0_8_;
          dVar57 = (((((auVar263._8_8_ + auVar263._0_8_) - auVar240._8_8_) + auVar240._0_8_) -
                    auVar419._8_8_) + auVar419._0_8_) - auVar120._8_8_;
        }
        if (dVar97 < 0.27) {
          dVar92 = (double)(~uVar20 & (ulong)dVar74);
          dVar109 = dVar109 * (dVar208 * dVar92 +
                              dVar92 * 10.0 * 1.7724538509055159 * dVar61 +
                              dVar25 * dVar92 * -72.0 +
                              dVar154 * dVar60 * dVar92 * 0.5 +
                              (dVar25 * dVar92 * 40.0 - dVar341 * dVar92) * dVar60 +
                              dVar341 * dVar92) * 24.0;
          dVar92 = dVar235 * 48.0 * dVar92;
        }
        else {
          dVar92 = (double)(uVar20 & (ulong)dVar74);
          auVar358._0_8_ = dVar316 * dVar92;
          auVar358._8_8_ = dVar335 * dVar92;
          auVar264 = divpd(auVar358,_DAT_00fdf440);
          auVar194._0_8_ = local_608 * dVar92;
          auVar194._8_8_ = dStack_600 * dVar92;
          auVar120 = divpd(auVar194,_DAT_00fdf450);
          auVar456._0_8_ = -dVar260 * dVar92;
          auVar456._8_8_ = dVar418 * dVar92;
          auVar213 = divpd(auVar456,_DAT_00fdf460);
          auVar277._0_8_ = dVar428 * dVar92;
          auVar277._8_8_ = dVar436 * dVar92;
          auVar240 = divpd(auVar277,_DAT_00fdf470);
          auVar195._0_8_ = dVar360 * dVar92;
          auVar195._8_8_ = dVar400 * dVar92;
          auVar263 = divpd(auVar195,_DAT_00fdf480);
          auVar278._0_8_ = local_768 * dVar92;
          auVar278._8_8_ = dStack_760 * dVar92;
          auVar209 = divpd(auVar278,_DAT_00fdf490);
          auVar434._0_8_ = dVar383 * dVar92;
          auVar434._8_8_ = dVar307 * dVar92;
          auVar405 = divpd(auVar434,_DAT_00fdf4a0);
          auVar279._0_8_ = local_c18 * dVar92;
          auVar279._8_8_ = dStack_c10 * dVar92;
          auVar162 = divpd(auVar279,_DAT_00fdf4b0);
          auVar196._0_8_ = dVar386 * dVar92;
          auVar196._8_8_ = dVar396 * dVar92;
          auVar419 = divpd(auVar196,_DAT_00fdf4c0);
          dVar109 = auVar419._0_8_ +
                    auVar162._0_8_ +
                    auVar405._0_8_ +
                    auVar209._0_8_ +
                    auVar263._0_8_ +
                    auVar240._0_8_ +
                    dVar414 * dVar92 * -3.0438311688311688e-05 +
                    (dVar441 * dVar92) / 1920.0 + dVar119 * dVar92 + auVar213._8_8_ + auVar213._0_8_
          ;
          dVar92 = auVar419._8_8_ +
                   auVar162._8_8_ +
                   auVar405._8_8_ +
                   auVar209._8_8_ +
                   auVar263._8_8_ +
                   auVar240._8_8_ +
                   (((auVar264._0_8_ - auVar264._8_8_) + auVar120._0_8_) - auVar120._8_8_) +
                   (dVar451 * dVar92) / 8.121312287389663e+33;
        }
        if (dVar97 < 0.32) {
          dVar74 = (double)(~uVar21 & (ulong)dVar74);
          dVar74 = dVar74 * 1.1428571428571428 * dVar110 +
                   dVar230 * 1.1428571428571428 *
                   (dVar206 * dVar62 * dVar74 +
                   dVar239 * dVar64 * dVar74 +
                   dVar112 * (dVar312 * dVar74 * 30720.0 +
                             dVar230 * dVar74 * 448.0 + dVar364 * dVar74 * -5760.0) +
                   dVar342 * dVar74 +
                   dVar384 * dVar63 * dVar74 * 0.5 +
                   (dVar313 * dVar74 * 26880.0 +
                   dVar339 * dVar74 * -2880.0 +
                   dVar158 * dVar74 * 768.0 + dVar74 * -1105920.0 * dVar111 + dVar74 * -8.0) *
                   dVar63);
        }
        else {
          dVar74 = (double)(uVar21 & (ulong)dVar74);
          auVar423._0_8_ = dVar367 * dVar74;
          auVar423._8_8_ = dVar379 * dVar74;
          auVar162 = divpd(auVar423,_DAT_00fdf4d0);
          auVar378._0_8_ = dVar314 * dVar74;
          auVar378._8_8_ = dVar437 * dVar74;
          auVar240 = divpd(auVar378,_DAT_00fdf4e0);
          auVar197._0_8_ = dVar387 * dVar74;
          auVar197._8_8_ = dVar397 * dVar74;
          auVar120 = divpd(auVar197,_DAT_00fdf4f0);
          auVar198._0_8_ = dVar448 * dVar74;
          auVar198._8_8_ = dVar308 * dVar74;
          auVar263 = divpd(auVar198,_DAT_00fdf500);
          auVar227._0_8_ = local_8a8 * dVar74;
          auVar227._8_8_ = dStack_8a0 * dVar74;
          auVar419 = divpd(auVar227,_DAT_00fdf510);
          auVar395._0_8_ = local_b28 * dVar74;
          auVar395._8_8_ = dStack_b20 * dVar74;
          auVar209 = divpd(auVar395,_DAT_00fdf520);
          dVar74 = (((((((((((((dVar72 * dVar74) / 8272281600.0 +
                              (dVar429 * dVar74) / -210862080.0 +
                              (dVar403 * dVar74) / 6150144.0 +
                              dVar452 * dVar74 * -4.6972703222703225e-06 +
                              dVar415 * dVar74 + (dVar401 * dVar74) / 9408.0) - auVar162._8_8_) +
                            auVar162._0_8_) - auVar240._8_8_) + auVar240._0_8_) - auVar120._8_8_) +
                        auVar120._0_8_) - auVar263._8_8_) + auVar263._0_8_) - auVar419._8_8_) +
                    auVar419._0_8_) - auVar209._8_8_) + auVar209._0_8_;
        }
        dVar25 = 0.0;
        if (dVar1 < local_c70) {
          dVar25 = dVar65 * (dVar237 * -0.010531842222222223 * dVar106 * dVar53 * dVar23 +
                            dVar74 * 1.8171205928321397 * dVar31 * 0.026329605555555555 * dVar207 +
                            dVar94 * dVar31 * dVar53 * dVar23 +
                            dVar153 * dVar236 * 0.018276169650205763 * dVar157 +
                            dVar156 * (dVar92 + dVar109) * 0.43209876543209874 * dVar157 +
                            (dVar57 + dVar24) * dVar155 + (local_a48 * dVar23) / -5.0 +
                            dVar31 * dVar153 * dVar59 *
                            dVar261 * 1.8171205928321397 * 0.026329605555555555);
        }
        if ((pdVar3 != (double *)0x0) && ((p->info->flags & 2) != 0)) {
          lVar6 = (long)(p->dim).vsigma * sVar7;
          pdVar3[lVar6 + 2] = dVar25 * __x + pdVar3[lVar6 + 2];
        }
        pdVar3 = out->vlapl;
        if ((pdVar3 != (double *)0x0) && ((~p->info->flags & 0x8002U) == 0)) {
          lVar6 = (long)(p->dim).vlapl * sVar7;
          pdVar3[lVar6] = pdVar3[lVar6] + 0.0;
          lVar6 = (long)(p->dim).vlapl * sVar7;
          pdVar3[lVar6 + 1] = pdVar3[lVar6 + 1] + 0.0;
        }
        pdVar3 = out->vtau;
        if ((pdVar3 != (double *)0x0) && ((~p->info->flags & 0x10002U) == 0)) {
          lVar6 = (long)(p->dim).vtau * sVar7;
          pdVar3[lVar6] =
               (double)(~uVar15 &
                       (ulong)((dVar95 / dVar22) * 1.8171205928321397 * dVar44 * dVar31 *
                              dVar229 * dVar27 * dVar43 * 1.4422495703074083 * 0.01610215409462904))
               * __x + pdVar3[lVar6];
        }
        if ((pdVar3 != (double *)0x0) && ((~p->info->flags & 0x10002U) == 0)) {
          lVar6 = (long)(p->dim).vtau * sVar7;
          pdVar3[lVar6 + 1] =
               __x * (double)(~-(ulong)(local_c70 <= dVar1) &
                             (ulong)((dVar152 / local_c70) * 1.8171205928321397 * dVar31 * dVar59 *
                                    dVar27 * dVar236 * dVar309 * 1.4422495703074083 *
                                    0.01610215409462904)) + pdVar3[lVar6 + 1];
        }
      }
      sVar7 = sVar7 + 1;
    } while (np != sVar7);
  }
  return;
}

Assistant:

static void
WORK_MGGA(ORDER_TXT, SPIN_TXT)
(const XC(func_type) *p, size_t np,
 const double *rho, const double *sigma, const double *lapl, const double *tau,
 xc_mgga_out_params *out)
{

#ifdef XC_DEBUG
  /* This throws an exception when floating point errors are encountered */
  //feenableexcept(FE_DIVBYZERO | FE_INVALID | FE_OVERFLOW);
#endif

  size_t ip;
  double dens;
  double my_rho[2]={0.0, 0.0};
  double my_sigma[3]={0.0, 0.0, 0.0};
  double my_tau[2]={0.0, 0.0};

  for(ip = 0; ip < np; ip++){
    /* Screen low density */
    dens = (p->nspin == XC_POLARIZED) ? VAR(rho, ip, 0) + VAR(rho, ip, 1) : VAR(rho, ip, 0);
    if(dens < p->dens_threshold)
      continue;

    /* sanity check of input parameters */
    my_rho[0] = m_max(p->dens_threshold, VAR(rho, ip, 0));
    my_sigma[0] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 0));

    /* Many functionals shamelessly divide by tau, so we set a reasonable threshold */
    /* skip all checks on tau for the kinetic functionals */
    if(p->info->flags & XC_FLAGS_NEEDS_TAU){
      my_tau[0] = m_max(p->tau_threshold, VAR(tau, ip, 0));
      if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
        /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
        my_sigma[0] = m_min(my_sigma[0], 8.0*my_rho[0]*my_tau[0]);
      }
    }
    /* lapl can have any values */

    if(p->nspin == XC_POLARIZED){
      double s_ave;

      my_rho[1] = m_max(p->dens_threshold, VAR(rho, ip, 1));
      my_sigma[2] = m_max(p->sigma_threshold * p->sigma_threshold, VAR(sigma, ip, 2));

      if(p->info->flags & XC_FLAGS_NEEDS_TAU){
        my_tau[1] = m_max(p->tau_threshold, VAR(tau, ip, 1));
        if(p->info->flags & XC_FLAGS_ENFORCE_FHC) {
          /* The Fermi hole curvature 1 - xs^2/(8*ts) must be positive */
          my_sigma[2] = m_min(my_sigma[2], 8.0*my_rho[1]*my_tau[1]);
        }
      }
      
      my_sigma[1] = VAR(sigma, ip, 1);
      s_ave = 0.5*(my_sigma[0] + my_sigma[2]);
      /* | grad n |^2 = |grad n_up + grad n_down|^2 > 0 */
      my_sigma[1] = (my_sigma[1] >= -s_ave ? my_sigma[1] : -s_ave);
      /* Since |grad n_up - grad n_down|^2 > 0 we also have */
      my_sigma[1] = (my_sigma[1] <= +s_ave ? my_sigma[1] : +s_ave);
    }

    FUNC(ORDER_TXT, SPIN_TXT)(p, ip, my_rho, my_sigma, &VAR(lapl, ip, 0), my_tau, out);

    /* check for NaNs */
#ifdef XC_DEBUG
    {
      const xc_dimensions *dim = &(p->dim);
      int ii, is_OK = 1;

      if(out->zk != NULL)
        is_OK = is_OK & isfinite(out->VAR(zk, ip, 0));

      if(out->vrho != NULL){
        for(ii=0; ii < dim->vrho; ii++)
          is_OK = is_OK && isfinite(out->VAR(vrho, ip, ii));
        for(ii=0; ii < dim->vsigma; ii++)
          is_OK = is_OK && isfinite(out->VAR(vsigma, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
          for(ii=0; ii < dim->vlapl; ii++)
            is_OK = is_OK && isfinite(out->VAR(vlapl, ip, ii));
        if(p->info->flags & XC_FLAGS_NEEDS_TAU)
          for(ii=0; ii < dim->vtau; ii++)
            is_OK = is_OK && isfinite(out->VAR(vtau, ip, ii));
      }

      if(!is_OK){
        printf("Problem in the evaluation of the functional\n");
        if(p->nspin == XC_UNPOLARIZED){
          printf("./xc-get_data %d 1 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0), VAR(tau, ip, 0));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le 0.0 %le 0.0 0.0 %le 0.0 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(lapl, ip, 0));
          else
            printf("%le 0.0 %le 0.0 0.0 0.0 0.0 %le 0.0\n",
                   VAR(rho, ip, 0), VAR(sigma, ip, 0), VAR(tau, ip, 0));
        }else{
          printf("./xc-get_data %d 2 ", p->info->number);
          if(p->info->flags & (XC_FLAGS_NEEDS_LAPLACIAN | XC_FLAGS_NEEDS_TAU))
            printf("%le %le %le %le %le %le %le %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
          else if(p->info->flags & XC_FLAGS_NEEDS_LAPLACIAN)
            printf("%le %le %le %le %le %le %le 0.0 0.0\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(lapl, ip, 0), VAR(lapl, ip, 1));
          else
            printf("%le %le %le %le %le 0.0 0.0 %le %le\n",
                   VAR(rho, ip, 0), VAR(rho, ip, 1),
                   VAR(sigma, ip, 0), VAR(sigma, ip, 1), VAR(sigma, ip, 2),
                   VAR(tau, ip, 0), VAR(tau, ip, 1));
        }
      }
    }
#endif
  }   /* for(ip) */

}